

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCRayQueryContext *pRVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  uint uVar98;
  int iVar99;
  undefined1 (*pauVar100) [32];
  uint uVar101;
  uint uVar102;
  int iVar103;
  ulong uVar104;
  ulong uVar105;
  long lVar106;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  long lVar107;
  float fVar108;
  float fVar141;
  float fVar143;
  undefined1 auVar111 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar112 [16];
  undefined4 uVar109;
  float fVar110;
  float fVar142;
  float fVar144;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar120 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar165;
  undefined8 uVar166;
  float fVar192;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar191;
  float fVar193;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar231;
  float fVar234;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar237;
  undefined1 auVar227 [32];
  float fVar232;
  float fVar235;
  float fVar238;
  undefined1 auVar228 [32];
  float fVar233;
  float fVar236;
  float fVar239;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [28];
  undefined1 auVar246 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar266;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar267;
  float fVar274;
  float fVar278;
  undefined1 auVar269 [28];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar277;
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar283;
  undefined1 in_ZMM10 [64];
  undefined1 auVar282 [64];
  float fVar284;
  undefined1 in_ZMM11 [64];
  undefined1 auVar286 [64];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar291 [64];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 (*local_b50) [32];
  ulong local_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  Primitive *local_970;
  ulong local_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint local_7e0;
  uint uStack_7dc;
  uint uStack_7d8;
  uint uStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar247 [32];
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  
  PVar8 = prim[1];
  uVar104 = (ulong)(byte)PVar8;
  lVar107 = uVar104 * 0x25;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar108 = *(float *)(prim + lVar107 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + lVar107 + 6));
  auVar111._0_4_ = fVar108 * auVar16._0_4_;
  auVar111._4_4_ = fVar108 * auVar16._4_4_;
  auVar111._8_4_ = fVar108 * auVar16._8_4_;
  auVar111._12_4_ = fVar108 * auVar16._12_4_;
  auVar167._0_4_ = fVar108 * auVar17._0_4_;
  auVar167._4_4_ = fVar108 * auVar17._4_4_;
  auVar167._8_4_ = fVar108 * auVar17._8_4_;
  auVar167._12_4_ = fVar108 * auVar17._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar104 * 4 + 6);
  auVar160 = vpmovsxbd_avx2(auVar16);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar104 * 5 + 6);
  auVar121 = vpmovsxbd_avx2(auVar17);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar104 * 6 + 6);
  auVar18 = vpmovsxbd_avx2(auVar2);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar104 * 0xf + 6);
  auVar19 = vpmovsxbd_avx2(auVar3);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar20 = vpmovsxbd_avx2(auVar4);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar104 + 6);
  auVar130 = vpmovsxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar104 * 0x1a + 6);
  auVar21 = vpmovsxbd_avx2(auVar6);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar104 * 0x1b + 6);
  auVar125 = vpmovsxbd_avx2(auVar7);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar104 * 0x1c + 6);
  auVar22 = vpmovsxbd_avx2(auVar117);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar126._4_4_ = auVar167._0_4_;
  auVar126._0_4_ = auVar167._0_4_;
  auVar126._8_4_ = auVar167._0_4_;
  auVar126._12_4_ = auVar167._0_4_;
  auVar126._16_4_ = auVar167._0_4_;
  auVar126._20_4_ = auVar167._0_4_;
  auVar126._24_4_ = auVar167._0_4_;
  auVar126._28_4_ = auVar167._0_4_;
  auVar16 = vmovshdup_avx(auVar167);
  uVar166 = auVar16._0_8_;
  auVar303._8_8_ = uVar166;
  auVar303._0_8_ = uVar166;
  auVar303._16_8_ = uVar166;
  auVar303._24_8_ = uVar166;
  auVar16 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar108 = auVar16._0_4_;
  auVar271._0_4_ = fVar108 * auVar18._0_4_;
  fVar141 = auVar16._4_4_;
  auVar271._4_4_ = fVar141 * auVar18._4_4_;
  auVar271._8_4_ = fVar108 * auVar18._8_4_;
  auVar271._12_4_ = fVar141 * auVar18._12_4_;
  auVar271._16_4_ = fVar108 * auVar18._16_4_;
  auVar271._20_4_ = fVar141 * auVar18._20_4_;
  auVar271._28_36_ = in_ZMM11._28_36_;
  auVar271._24_4_ = fVar108 * auVar18._24_4_;
  auVar255._0_4_ = auVar130._0_4_ * fVar108;
  auVar255._4_4_ = auVar130._4_4_ * fVar141;
  auVar255._8_4_ = auVar130._8_4_ * fVar108;
  auVar255._12_4_ = auVar130._12_4_ * fVar141;
  auVar255._16_4_ = auVar130._16_4_ * fVar108;
  auVar255._20_4_ = auVar130._20_4_ * fVar141;
  auVar255._28_36_ = in_ZMM10._28_36_;
  auVar255._24_4_ = auVar130._24_4_ * fVar108;
  auVar270._0_4_ = auVar22._0_4_ * fVar108;
  auVar270._4_4_ = auVar22._4_4_ * fVar141;
  auVar270._8_4_ = auVar22._8_4_ * fVar108;
  auVar270._12_4_ = auVar22._12_4_ * fVar141;
  auVar270._16_4_ = auVar22._16_4_ * fVar108;
  auVar270._20_4_ = auVar22._20_4_ * fVar141;
  auVar270._24_4_ = auVar22._24_4_ * fVar108;
  auVar270._28_4_ = 0;
  auVar16 = vfmadd231ps_fma(auVar271._0_32_,auVar303,auVar121);
  auVar17 = vfmadd231ps_fma(auVar255._0_32_,auVar303,auVar20);
  auVar2 = vfmadd231ps_fma(auVar270,auVar125,auVar303);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,auVar160);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar126,auVar19);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar21,auVar126);
  auVar182._4_4_ = auVar111._0_4_;
  auVar182._0_4_ = auVar111._0_4_;
  auVar182._8_4_ = auVar111._0_4_;
  auVar182._12_4_ = auVar111._0_4_;
  auVar182._16_4_ = auVar111._0_4_;
  auVar182._20_4_ = auVar111._0_4_;
  auVar182._24_4_ = auVar111._0_4_;
  auVar182._28_4_ = auVar111._0_4_;
  auVar16 = vmovshdup_avx(auVar111);
  uVar166 = auVar16._0_8_;
  auVar304._8_8_ = uVar166;
  auVar304._0_8_ = uVar166;
  auVar304._16_8_ = uVar166;
  auVar304._24_8_ = uVar166;
  auVar16 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar108 = auVar16._0_4_;
  auVar180._0_4_ = fVar108 * auVar18._0_4_;
  fVar141 = auVar16._4_4_;
  auVar180._4_4_ = fVar141 * auVar18._4_4_;
  auVar180._8_4_ = fVar108 * auVar18._8_4_;
  auVar180._12_4_ = fVar141 * auVar18._12_4_;
  auVar180._16_4_ = fVar108 * auVar18._16_4_;
  auVar180._20_4_ = fVar141 * auVar18._20_4_;
  auVar180._24_4_ = fVar108 * auVar18._24_4_;
  auVar180._28_4_ = 0;
  auVar156._4_4_ = auVar130._4_4_ * fVar141;
  auVar156._0_4_ = auVar130._0_4_ * fVar108;
  auVar156._8_4_ = auVar130._8_4_ * fVar108;
  auVar156._12_4_ = auVar130._12_4_ * fVar141;
  auVar156._16_4_ = auVar130._16_4_ * fVar108;
  auVar156._20_4_ = auVar130._20_4_ * fVar141;
  auVar156._24_4_ = auVar130._24_4_ * fVar108;
  auVar156._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = auVar22._4_4_ * fVar141;
  auVar18._0_4_ = auVar22._0_4_ * fVar108;
  auVar18._8_4_ = auVar22._8_4_ * fVar108;
  auVar18._12_4_ = auVar22._12_4_ * fVar141;
  auVar18._16_4_ = auVar22._16_4_ * fVar108;
  auVar18._20_4_ = auVar22._20_4_ * fVar141;
  auVar18._24_4_ = auVar22._24_4_ * fVar108;
  auVar18._28_4_ = fVar141;
  auVar16 = vfmadd231ps_fma(auVar180,auVar304,auVar121);
  auVar4 = vfmadd231ps_fma(auVar156,auVar304,auVar20);
  auVar5 = vfmadd231ps_fma(auVar18,auVar304,auVar125);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar182,auVar160);
  local_920._8_4_ = 0x7fffffff;
  local_920._0_8_ = 0x7fffffff7fffffff;
  local_920._12_4_ = 0x7fffffff;
  local_920._16_4_ = 0x7fffffff;
  local_920._20_4_ = 0x7fffffff;
  local_920._24_4_ = 0x7fffffff;
  local_920._28_4_ = 0x7fffffff;
  auVar296._8_4_ = 0x219392ef;
  auVar296._0_8_ = 0x219392ef219392ef;
  auVar296._12_4_ = 0x219392ef;
  auVar296._16_4_ = 0x219392ef;
  auVar296._20_4_ = 0x219392ef;
  auVar296._24_4_ = 0x219392ef;
  auVar296._28_4_ = 0x219392ef;
  auVar160 = vandps_avx(ZEXT1632(auVar3),local_920);
  auVar160 = vcmpps_avx(auVar160,auVar296,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar3),auVar296,auVar160);
  auVar160 = vandps_avx(ZEXT1632(auVar17),local_920);
  auVar160 = vcmpps_avx(auVar160,auVar296,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar17),auVar296,auVar160);
  auVar160 = vandps_avx(ZEXT1632(auVar2),local_920);
  auVar160 = vcmpps_avx(auVar160,auVar296,1);
  auVar160 = vblendvps_avx(ZEXT1632(auVar2),auVar296,auVar160);
  auVar167 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar182,auVar19);
  auVar112 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar182,auVar21);
  fVar108 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar107 + 0x16)) *
            *(float *)(prim + lVar107 + 0x1a);
  auVar123._4_4_ = fVar108;
  auVar123._0_4_ = fVar108;
  auVar123._8_4_ = fVar108;
  auVar123._12_4_ = fVar108;
  auVar123._16_4_ = fVar108;
  auVar123._20_4_ = fVar108;
  auVar123._24_4_ = fVar108;
  auVar123._28_4_ = fVar108;
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 7 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0xb + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 9 + 6));
  auVar3 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0xd + 6));
  auVar19 = vcvtdq2ps_avx(auVar130);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar4 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x12 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar105 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 2 + uVar105 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar130 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 + 6));
  auVar5 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar19 = vcvtdq2ps_avx(auVar130);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x18 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar6 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x1d + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 + (ulong)(byte)PVar8 * 0x20 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar7 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar8 * 0x20 - uVar104) + 6))
  ;
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x23 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar117 = vfmadd213ps_fma(auVar20,auVar123,auVar19);
  auVar19 = vrcpps_avx(auVar121);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = 0x3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar121,auVar19,auVar229);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar19,auVar19);
  auVar121 = vrcpps_avx(auVar18);
  auVar17 = vfnmadd213ps_fma(auVar18,auVar121,auVar229);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar121,auVar121);
  auVar121 = vrcpps_avx(auVar160);
  auVar2 = vfnmadd213ps_fma(auVar160,auVar121,auVar229);
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar121,auVar121);
  auVar160 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar111));
  auVar121 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar111));
  auVar19._4_4_ = auVar16._4_4_ * auVar160._4_4_;
  auVar19._0_4_ = auVar16._0_4_ * auVar160._0_4_;
  auVar19._8_4_ = auVar16._8_4_ * auVar160._8_4_;
  auVar19._12_4_ = auVar16._12_4_ * auVar160._12_4_;
  auVar19._16_4_ = auVar160._16_4_ * 0.0;
  auVar19._20_4_ = auVar160._20_4_ * 0.0;
  auVar19._24_4_ = auVar160._24_4_ * 0.0;
  auVar19._28_4_ = auVar160._28_4_;
  auVar20._4_4_ = auVar16._4_4_ * auVar121._4_4_;
  auVar20._0_4_ = auVar16._0_4_ * auVar121._0_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar121._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar121._12_4_;
  auVar20._16_4_ = auVar121._16_4_ * 0.0;
  auVar20._20_4_ = auVar121._20_4_ * 0.0;
  auVar20._24_4_ = auVar121._24_4_ * 0.0;
  auVar20._28_4_ = auVar121._28_4_;
  auVar160 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar167));
  auVar121 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar167));
  auVar130._4_4_ = auVar17._4_4_ * auVar160._4_4_;
  auVar130._0_4_ = auVar17._0_4_ * auVar160._0_4_;
  auVar130._8_4_ = auVar17._8_4_ * auVar160._8_4_;
  auVar130._12_4_ = auVar17._12_4_ * auVar160._12_4_;
  auVar130._16_4_ = auVar160._16_4_ * 0.0;
  auVar130._20_4_ = auVar160._20_4_ * 0.0;
  auVar130._24_4_ = auVar160._24_4_ * 0.0;
  auVar130._28_4_ = auVar160._28_4_;
  auVar21._4_4_ = auVar17._4_4_ * auVar121._4_4_;
  auVar21._0_4_ = auVar17._0_4_ * auVar121._0_4_;
  auVar21._8_4_ = auVar17._8_4_ * auVar121._8_4_;
  auVar21._12_4_ = auVar17._12_4_ * auVar121._12_4_;
  auVar21._16_4_ = auVar121._16_4_ * 0.0;
  auVar21._20_4_ = auVar121._20_4_ * 0.0;
  auVar21._24_4_ = auVar121._24_4_ * 0.0;
  auVar21._28_4_ = auVar121._28_4_;
  auVar160 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar112));
  auVar125._4_4_ = auVar2._4_4_ * auVar160._4_4_;
  auVar125._0_4_ = auVar2._0_4_ * auVar160._0_4_;
  auVar125._8_4_ = auVar2._8_4_ * auVar160._8_4_;
  auVar125._12_4_ = auVar2._12_4_ * auVar160._12_4_;
  auVar125._16_4_ = auVar160._16_4_ * 0.0;
  auVar125._20_4_ = auVar160._20_4_ * 0.0;
  auVar125._24_4_ = auVar160._24_4_ * 0.0;
  auVar125._28_4_ = auVar160._28_4_;
  auVar160 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar112));
  auVar22._4_4_ = auVar2._4_4_ * auVar160._4_4_;
  auVar22._0_4_ = auVar2._0_4_ * auVar160._0_4_;
  auVar22._8_4_ = auVar2._8_4_ * auVar160._8_4_;
  auVar22._12_4_ = auVar2._12_4_ * auVar160._12_4_;
  auVar22._16_4_ = auVar160._16_4_ * 0.0;
  auVar22._20_4_ = auVar160._20_4_ * 0.0;
  auVar22._24_4_ = auVar160._24_4_ * 0.0;
  auVar22._28_4_ = auVar160._28_4_;
  auVar160 = vpminsd_avx2(auVar19,auVar20);
  auVar121 = vpminsd_avx2(auVar130,auVar21);
  auVar160 = vmaxps_avx(auVar160,auVar121);
  auVar121 = vpminsd_avx2(auVar125,auVar22);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar256._4_4_ = uVar109;
  auVar256._0_4_ = uVar109;
  auVar256._8_4_ = uVar109;
  auVar256._12_4_ = uVar109;
  auVar256._16_4_ = uVar109;
  auVar256._20_4_ = uVar109;
  auVar256._24_4_ = uVar109;
  auVar256._28_4_ = uVar109;
  auVar121 = vmaxps_avx(auVar121,auVar256);
  auVar160 = vmaxps_avx(auVar160,auVar121);
  local_2e0._4_4_ = auVar160._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar160._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar160._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar160._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar160._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar160._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar160._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar160._28_4_;
  auVar160 = vpmaxsd_avx2(auVar19,auVar20);
  auVar121 = vpmaxsd_avx2(auVar130,auVar21);
  auVar160 = vminps_avx(auVar160,auVar121);
  auVar121 = vpmaxsd_avx2(auVar125,auVar22);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar181._4_4_ = uVar109;
  auVar181._0_4_ = uVar109;
  auVar181._8_4_ = uVar109;
  auVar181._12_4_ = uVar109;
  auVar181._16_4_ = uVar109;
  auVar181._20_4_ = uVar109;
  auVar181._24_4_ = uVar109;
  auVar181._28_4_ = uVar109;
  auVar121 = vminps_avx(auVar121,auVar181);
  auVar160 = vminps_avx(auVar160,auVar121);
  auVar23._4_4_ = auVar160._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar160._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar160._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar160._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar160._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar160._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar160._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar160._28_4_;
  auVar160._1_3_ = 0;
  auVar160[0] = PVar8;
  auVar160[4] = PVar8;
  auVar160._5_3_ = 0;
  auVar160[8] = PVar8;
  auVar160._9_3_ = 0;
  auVar160[0xc] = PVar8;
  auVar160._13_3_ = 0;
  auVar160[0x10] = PVar8;
  auVar160._17_3_ = 0;
  auVar160[0x14] = PVar8;
  auVar160._21_3_ = 0;
  auVar160[0x18] = PVar8;
  auVar160._25_3_ = 0;
  auVar160[0x1c] = PVar8;
  auVar160._29_3_ = 0;
  auVar121 = vpcmpgtd_avx2(auVar160,_DAT_01fe9900);
  auVar160 = vcmpps_avx(local_2e0,auVar23,2);
  auVar160 = vandps_avx(auVar160,auVar121);
  uVar98 = vmovmskps_avx(auVar160);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_7c0 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  local_b50 = (undefined1 (*) [32])&local_3c0;
  iVar99 = 1 << ((uint)k & 0x1f);
  auVar122._4_4_ = iVar99;
  auVar122._0_4_ = iVar99;
  auVar122._8_4_ = iVar99;
  auVar122._12_4_ = iVar99;
  auVar122._16_4_ = iVar99;
  auVar122._20_4_ = iVar99;
  auVar122._24_4_ = iVar99;
  auVar122._28_4_ = iVar99;
  auVar121 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar160 = vpand_avx2(auVar122,auVar121);
  local_6a0 = vpcmpeqd_avx2(auVar160,auVar121);
  local_7e0 = 0x80000000;
  uStack_7dc = 0x80000000;
  uStack_7d8 = 0x80000000;
  uStack_7d4 = 0x80000000;
  fStack_7d0 = -0.0;
  fStack_7cc = -0.0;
  fStack_7c8 = -0.0;
  uStack_7c4 = 0x80000000;
  local_970 = prim;
LAB_0189f2aa:
  lVar107 = 0;
  local_968 = (ulong)uVar98;
  for (uVar104 = local_968; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
    lVar107 = lVar107 + 1;
  }
  uVar98 = *(uint *)(local_970 + 2);
  local_680 = *(uint *)(local_970 + lVar107 * 4 + 6);
  local_b48 = (ulong)local_680;
  pGVar10 = (context->scene->geometries).items[uVar98].ptr;
  uVar104 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                            local_b48 *
                            pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar108 = (pGVar10->time_range).lower;
  fVar108 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar108) / ((pGVar10->time_range).upper - fVar108));
  auVar16 = vroundss_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),9);
  auVar16 = vminss_avx(auVar16,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar16 = vmaxss_avx(ZEXT816(0) << 0x20,auVar16);
  fVar108 = fVar108 - auVar16._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar106 = (long)(int)auVar16._0_4_ * 0x38;
  lVar107 = *(long *)(_Var11 + 0x10 + lVar106);
  lVar12 = *(long *)(_Var11 + 0x38 + lVar106);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar106);
  pfVar1 = (float *)(lVar12 + uVar104 * lVar13);
  auVar112._0_4_ = fVar108 * *pfVar1;
  auVar112._4_4_ = fVar108 * pfVar1[1];
  auVar112._8_4_ = fVar108 * pfVar1[2];
  auVar112._12_4_ = fVar108 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar104 + 1) * lVar13);
  auVar148._0_4_ = fVar108 * *pfVar1;
  auVar148._4_4_ = fVar108 * pfVar1[1];
  auVar148._8_4_ = fVar108 * pfVar1[2];
  auVar148._12_4_ = fVar108 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar104 + 2) * lVar13);
  auVar177._0_4_ = fVar108 * *pfVar1;
  auVar177._4_4_ = fVar108 * pfVar1[1];
  auVar177._8_4_ = fVar108 * pfVar1[2];
  auVar177._12_4_ = fVar108 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar104 + 3));
  auVar218._0_4_ = fVar108 * *pfVar1;
  auVar218._4_4_ = fVar108 * pfVar1[1];
  auVar218._8_4_ = fVar108 * pfVar1[2];
  auVar218._12_4_ = fVar108 * pfVar1[3];
  lVar12 = *(long *)(_Var11 + lVar106);
  fVar108 = 1.0 - fVar108;
  auVar168._4_4_ = fVar108;
  auVar168._0_4_ = fVar108;
  auVar168._8_4_ = fVar108;
  auVar168._12_4_ = fVar108;
  auVar3 = vfmadd231ps_fma(auVar112,auVar168,*(undefined1 (*) [16])(lVar12 + lVar107 * uVar104));
  auVar4 = vfmadd231ps_fma(auVar148,auVar168,
                           *(undefined1 (*) [16])(lVar12 + lVar107 * (uVar104 + 1)));
  auVar5 = vfmadd231ps_fma(auVar177,auVar168,
                           *(undefined1 (*) [16])(lVar12 + lVar107 * (uVar104 + 2)));
  auVar6 = vfmadd231ps_fma(auVar218,auVar168,
                           *(undefined1 (*) [16])(lVar12 + lVar107 * (uVar104 + 3)));
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar17 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar279._4_4_ = uVar109;
  auVar279._0_4_ = uVar109;
  auVar279._8_4_ = uVar109;
  auVar279._12_4_ = uVar109;
  fStack_8b0 = (float)uVar109;
  _local_8c0 = auVar279;
  fStack_8ac = (float)uVar109;
  fStack_8a8 = (float)uVar109;
  register0x0000149c = uVar109;
  auVar282 = ZEXT3264(_local_8c0);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar285._4_4_ = uVar109;
  auVar285._0_4_ = uVar109;
  auVar285._8_4_ = uVar109;
  auVar285._12_4_ = uVar109;
  fStack_890 = (float)uVar109;
  _local_8a0 = auVar285;
  fStack_88c = (float)uVar109;
  fStack_888 = (float)uVar109;
  register0x000014dc = uVar109;
  auVar286 = ZEXT3264(_local_8a0);
  auVar16 = vunpcklps_avx(auVar279,auVar285);
  fVar108 = *(float *)(ray + k * 4 + 0xc0);
  auVar287._4_4_ = fVar108;
  auVar287._0_4_ = fVar108;
  auVar287._8_4_ = fVar108;
  auVar287._12_4_ = fVar108;
  fStack_a70 = fVar108;
  _local_a80 = auVar287;
  fStack_a6c = fVar108;
  fStack_a68 = fVar108;
  register0x0000151c = fVar108;
  auVar291 = ZEXT3264(_local_a80);
  local_a10 = vinsertps_avx(auVar16,auVar287,0x28);
  auVar240._0_4_ = (auVar3._0_4_ + auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_) * 0.25;
  auVar240._4_4_ = (auVar3._4_4_ + auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_) * 0.25;
  auVar240._8_4_ = (auVar3._8_4_ + auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_) * 0.25;
  auVar240._12_4_ = (auVar3._12_4_ + auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_) * 0.25;
  auVar16 = vsubps_avx(auVar240,auVar17);
  auVar16 = vdpps_avx(auVar16,local_a10,0x7f);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar271 = ZEXT1664(local_a20);
  auVar2 = vrcpss_avx(local_a20,local_a20);
  auVar7 = vfnmadd213ss_fma(auVar2,local_a20,ZEXT416(0x40000000));
  local_2c0 = auVar16._0_4_ * auVar2._0_4_ * auVar7._0_4_;
  auVar249._4_4_ = local_2c0;
  auVar249._0_4_ = local_2c0;
  auVar249._8_4_ = local_2c0;
  auVar249._12_4_ = local_2c0;
  fStack_a50 = local_2c0;
  _local_a60 = auVar249;
  fStack_a4c = local_2c0;
  fStack_a48 = local_2c0;
  fStack_a44 = local_2c0;
  auVar16 = vfmadd231ps_fma(auVar17,local_a10,auVar249);
  auVar16 = vblendps_avx(auVar16,_DAT_01f7aa10,8);
  auVar2 = vsubps_avx(auVar3,auVar16);
  auVar3 = vsubps_avx(auVar5,auVar16);
  auVar4 = vsubps_avx(auVar4,auVar16);
  auVar5 = vsubps_avx(auVar6,auVar16);
  auVar16 = vmovshdup_avx(auVar2);
  local_1e0 = auVar16._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar16 = vshufps_avx(auVar2,auVar2,0xaa);
  local_200 = auVar16._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar16 = vshufps_avx(auVar2,auVar2,0xff);
  local_220 = auVar16._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar16 = vmovshdup_avx(auVar4);
  local_500 = auVar16._0_8_;
  auVar16 = vshufps_avx(auVar4,auVar4,0xaa);
  local_240 = auVar16._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar16 = vshufps_avx(auVar4,auVar4,0xff);
  local_260 = auVar16._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar16 = vmovshdup_avx(auVar3);
  local_520 = auVar16._0_8_;
  auVar16 = vshufps_avx(auVar3,auVar3,0xaa);
  local_540 = auVar16._0_8_;
  auVar16 = vshufps_avx(auVar3,auVar3,0xff);
  local_560 = auVar16._0_8_;
  auVar16 = vmovshdup_avx(auVar5);
  local_580 = auVar16._0_8_;
  auVar16 = vshufps_avx(auVar5,auVar5,0xaa);
  local_5a0 = auVar16._0_8_;
  auVar16 = vshufps_avx(auVar5,auVar5,0xff);
  local_5c0 = auVar16._0_8_;
  auVar16 = vfmadd231ps_fma(ZEXT432((uint)(fVar108 * fVar108)),_local_8a0,_local_8a0);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),_local_8c0,_local_8c0);
  uVar109 = auVar16._0_4_;
  local_280._4_4_ = uVar109;
  local_280._0_4_ = uVar109;
  local_280._8_4_ = uVar109;
  local_280._12_4_ = uVar109;
  local_280._16_4_ = uVar109;
  local_280._20_4_ = uVar109;
  local_280._24_4_ = uVar109;
  local_280._28_4_ = uVar109;
  auVar255 = ZEXT3264(local_280);
  fVar108 = *(float *)(ray + k * 4 + 0x60);
  local_980 = ZEXT416((uint)local_2c0);
  local_2c0 = fVar108 - local_2c0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  uVar104 = 0;
  iVar99 = 1;
  local_5e0 = auVar2._0_4_;
  local_2a0 = auVar4._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_600 = auVar3._0_4_;
  fVar141 = auVar5._0_4_;
  local_640 = vandps_avx(local_280,local_920);
  auVar16 = vsqrtss_avx(local_a20,local_a20);
  auVar17 = vsqrtss_avx(local_a20,local_a20);
  local_6b0 = ZEXT816(0x3f80000000000000);
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_670 = local_680;
  uStack_66c = local_680;
  uStack_668 = local_680;
  uStack_664 = local_680;
  local_660 = uVar98;
  uStack_65c = uVar98;
  uStack_658 = uVar98;
  uStack_654 = uVar98;
  uStack_650 = uVar98;
  uStack_64c = uVar98;
  uStack_648 = uVar98;
  uStack_644 = uVar98;
  local_620 = fVar141;
  fStack_61c = fVar141;
  fStack_618 = fVar141;
  fStack_614 = fVar141;
  fStack_610 = fVar141;
  fStack_60c = fVar141;
  fStack_608 = fVar141;
  fStack_604 = fVar141;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  do {
    auVar209._8_4_ = 0x3f800000;
    auVar209._0_8_ = 0x3f8000003f800000;
    auVar209._12_4_ = 0x3f800000;
    auVar209._16_4_ = 0x3f800000;
    auVar209._20_4_ = 0x3f800000;
    auVar209._24_4_ = 0x3f800000;
    auVar209._28_4_ = 0x3f800000;
    iVar103 = (int)uVar104;
    auVar6 = vmovshdup_avx(local_6b0);
    auVar6 = vsubps_avx(auVar6,local_6b0);
    local_860._0_4_ = auVar6._0_4_;
    fVar238 = (float)local_860._0_4_ * 0.04761905;
    uVar109 = local_6b0._0_4_;
    local_840._4_4_ = uVar109;
    local_840._0_4_ = uVar109;
    local_840._8_4_ = uVar109;
    local_840._12_4_ = uVar109;
    local_840._16_4_ = uVar109;
    local_840._20_4_ = uVar109;
    local_840._24_4_ = uVar109;
    local_840._28_4_ = uVar109;
    local_860._4_4_ = local_860._0_4_;
    local_860._8_4_ = local_860._0_4_;
    local_860._12_4_ = local_860._0_4_;
    local_860._16_4_ = local_860._0_4_;
    local_860._20_4_ = local_860._0_4_;
    local_860._24_4_ = local_860._0_4_;
    local_860._28_4_ = local_860._0_4_;
    auVar6 = vfmadd231ps_fma(local_840,local_860,_DAT_01faff20);
    auVar160 = vsubps_avx(auVar209,ZEXT1632(auVar6));
    fVar217 = auVar160._0_4_;
    fVar234 = auVar160._4_4_;
    fVar233 = auVar160._8_4_;
    fVar266 = auVar160._12_4_;
    fVar235 = auVar160._16_4_;
    fVar284 = auVar160._20_4_;
    fVar239 = auVar160._24_4_;
    fVar110 = fVar217 * fVar217 * fVar217;
    fVar142 = fVar234 * fVar234 * fVar234;
    fVar143 = fVar233 * fVar233 * fVar233;
    fVar144 = fVar266 * fVar266 * fVar266;
    fVar145 = fVar235 * fVar235 * fVar235;
    fVar146 = fVar284 * fVar284 * fVar284;
    fVar147 = fVar239 * fVar239 * fVar239;
    fVar231 = auVar6._0_4_;
    fVar237 = auVar6._4_4_;
    fVar232 = auVar6._8_4_;
    fVar236 = auVar6._12_4_;
    fVar165 = fVar231 * fVar231 * fVar231;
    fVar191 = fVar237 * fVar237 * fVar237;
    fVar192 = fVar232 * fVar232 * fVar232;
    fVar193 = fVar236 * fVar236 * fVar236;
    fVar267 = fVar217 * fVar231;
    fVar272 = fVar234 * fVar237;
    fVar273 = fVar233 * fVar232;
    fVar274 = fVar266 * fVar236;
    fVar275 = fVar235 * 0.0;
    fVar277 = fVar284 * 0.0;
    fVar278 = fVar239 * 0.0;
    fVar283 = auVar282._28_4_ + auVar291._28_4_;
    auVar25._4_4_ = fVar142 * 0.16666667;
    auVar25._0_4_ = fVar110 * 0.16666667;
    auVar25._8_4_ = fVar143 * 0.16666667;
    auVar25._12_4_ = fVar144 * 0.16666667;
    auVar25._16_4_ = fVar145 * 0.16666667;
    auVar25._20_4_ = fVar146 * 0.16666667;
    auVar25._24_4_ = fVar147 * 0.16666667;
    auVar25._28_4_ = fVar283 + (float)local_860._0_4_;
    auVar26._4_4_ =
         (fVar234 * fVar272 * 12.0 + fVar272 * fVar237 * 6.0 + fVar191 + fVar142 * 4.0) * 0.16666667
    ;
    auVar26._0_4_ =
         (fVar217 * fVar267 * 12.0 + fVar267 * fVar231 * 6.0 + fVar165 + fVar110 * 4.0) * 0.16666667
    ;
    auVar26._8_4_ =
         (fVar233 * fVar273 * 12.0 + fVar273 * fVar232 * 6.0 + fVar192 + fVar143 * 4.0) * 0.16666667
    ;
    auVar26._12_4_ =
         (fVar266 * fVar274 * 12.0 + fVar274 * fVar236 * 6.0 + fVar193 + fVar144 * 4.0) * 0.16666667
    ;
    auVar26._16_4_ =
         (fVar235 * fVar275 * 12.0 + fVar275 * 0.0 * 6.0 + fVar145 * 4.0 + 0.0) * 0.16666667;
    auVar26._20_4_ =
         (fVar284 * fVar277 * 12.0 + fVar277 * 0.0 * 6.0 + fVar146 * 4.0 + 0.0) * 0.16666667;
    auVar26._24_4_ =
         (fVar239 * fVar278 * 12.0 + fVar278 * 0.0 * 6.0 + fVar147 * 4.0 + 0.0) * 0.16666667;
    auVar26._28_4_ = auVar286._28_4_;
    auVar27._4_4_ =
         (fVar191 * 4.0 + fVar142 + fVar272 * fVar237 * 12.0 + fVar234 * fVar272 * 6.0) * 0.16666667
    ;
    auVar27._0_4_ =
         (fVar165 * 4.0 + fVar110 + fVar267 * fVar231 * 12.0 + fVar217 * fVar267 * 6.0) * 0.16666667
    ;
    auVar27._8_4_ =
         (fVar192 * 4.0 + fVar143 + fVar273 * fVar232 * 12.0 + fVar233 * fVar273 * 6.0) * 0.16666667
    ;
    auVar27._12_4_ =
         (fVar193 * 4.0 + fVar144 + fVar274 * fVar236 * 12.0 + fVar266 * fVar274 * 6.0) * 0.16666667
    ;
    auVar27._16_4_ = (fVar145 + 0.0 + fVar275 * 0.0 * 12.0 + fVar235 * fVar275 * 6.0) * 0.16666667;
    auVar27._20_4_ = (fVar146 + 0.0 + fVar277 * 0.0 * 12.0 + fVar284 * fVar277 * 6.0) * 0.16666667;
    auVar27._24_4_ = (fVar147 + 0.0 + fVar278 * 0.0 * 12.0 + fVar239 * fVar278 * 6.0) * 0.16666667;
    auVar27._28_4_ = auVar291._28_4_;
    fVar165 = fVar165 * 0.16666667;
    fVar191 = fVar191 * 0.16666667;
    fVar192 = fVar192 * 0.16666667;
    fVar193 = fVar193 * 0.16666667;
    auVar28._4_4_ = fVar191 * fStack_61c;
    auVar28._0_4_ = fVar165 * local_620;
    auVar28._8_4_ = fVar192 * fStack_618;
    auVar28._12_4_ = fVar193 * fStack_614;
    auVar28._16_4_ = fStack_610 * 0.0;
    auVar28._20_4_ = fStack_60c * 0.0;
    auVar28._24_4_ = fStack_608 * 0.0;
    auVar28._28_4_ = local_860._0_4_;
    auVar29._4_4_ = fVar191 * local_580._4_4_;
    auVar29._0_4_ = fVar165 * (float)local_580;
    auVar29._8_4_ = fVar192 * (float)uStack_578;
    auVar29._12_4_ = fVar193 * uStack_578._4_4_;
    auVar29._16_4_ = (float)uStack_570 * 0.0;
    auVar29._20_4_ = uStack_570._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_568 * 0.0;
    auVar29._28_4_ = fVar283 + DAT_01faff20._28_4_ + 0.0;
    auVar30._4_4_ = fVar191 * local_5a0._4_4_;
    auVar30._0_4_ = fVar165 * (float)local_5a0;
    auVar30._8_4_ = fVar192 * (float)uStack_598;
    auVar30._12_4_ = fVar193 * uStack_598._4_4_;
    auVar30._16_4_ = (float)uStack_590 * 0.0;
    auVar30._20_4_ = uStack_590._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_588 * 0.0;
    auVar30._28_4_ = 0;
    auVar31._4_4_ = fVar191 * local_5c0._4_4_;
    auVar31._0_4_ = fVar165 * (float)local_5c0;
    auVar31._8_4_ = fVar192 * (float)uStack_5b8;
    auVar31._12_4_ = fVar193 * uStack_5b8._4_4_;
    auVar31._16_4_ = (float)uStack_5b0 * 0.0;
    auVar31._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar31._24_4_ = (float)uStack_5a8 * 0.0;
    auVar31._28_4_ = 0x3e2aaaab;
    auVar77._4_4_ = uStack_5fc;
    auVar77._0_4_ = local_600;
    auVar77._8_4_ = uStack_5f8;
    auVar77._12_4_ = uStack_5f4;
    auVar77._16_4_ = uStack_5f0;
    auVar77._20_4_ = uStack_5ec;
    auVar77._24_4_ = uStack_5e8;
    auVar77._28_4_ = uStack_5e4;
    auVar6 = vfmadd231ps_fma(auVar28,auVar27,auVar77);
    auVar85._8_8_ = uStack_518;
    auVar85._0_8_ = local_520;
    auVar85._16_8_ = uStack_510;
    auVar85._24_8_ = uStack_508;
    auVar7 = vfmadd231ps_fma(auVar29,auVar27,auVar85);
    auVar83._8_8_ = uStack_538;
    auVar83._0_8_ = local_540;
    auVar83._16_8_ = uStack_530;
    auVar83._24_8_ = uStack_528;
    auVar117 = vfmadd231ps_fma(auVar30,auVar27,auVar83);
    auVar81._8_8_ = uStack_558;
    auVar81._0_8_ = local_560;
    auVar81._16_8_ = uStack_550;
    auVar81._24_8_ = uStack_548;
    auVar111 = vfmadd231ps_fma(auVar31,auVar27,auVar81);
    auVar92._4_4_ = uStack_29c;
    auVar92._0_4_ = local_2a0;
    auVar92._8_4_ = uStack_298;
    auVar92._12_4_ = uStack_294;
    auVar92._16_4_ = uStack_290;
    auVar92._20_4_ = uStack_28c;
    auVar92._24_4_ = uStack_288;
    auVar92._28_4_ = uStack_284;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar26,auVar92);
    auVar87._8_8_ = uStack_4f8;
    auVar87._0_8_ = local_500;
    auVar87._16_8_ = uStack_4f0;
    auVar87._24_8_ = uStack_4e8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar26,auVar87);
    auVar94._8_8_ = uStack_238;
    auVar94._0_8_ = local_240;
    auVar94._16_8_ = uStack_230;
    auVar94._24_8_ = uStack_228;
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar26,auVar94);
    auVar93._8_8_ = uStack_258;
    auVar93._0_8_ = local_260;
    auVar93._16_8_ = uStack_250;
    auVar93._24_8_ = uStack_248;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar93,auVar26);
    auVar79._4_4_ = uStack_5dc;
    auVar79._0_4_ = local_5e0;
    auVar79._8_4_ = uStack_5d8;
    auVar79._12_4_ = uStack_5d4;
    auVar79._16_4_ = uStack_5d0;
    auVar79._20_4_ = uStack_5cc;
    auVar79._24_4_ = uStack_5c8;
    auVar79._28_4_ = uStack_5c4;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar25,auVar79);
    auVar123 = ZEXT1632(auVar6);
    auVar97._8_8_ = uStack_1d8;
    auVar97._0_8_ = local_1e0;
    auVar97._16_8_ = uStack_1d0;
    auVar97._24_8_ = uStack_1c8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,auVar97);
    local_9c0 = ZEXT1632(auVar7);
    auVar96._8_8_ = uStack_1f8;
    auVar96._0_8_ = local_200;
    auVar96._16_8_ = uStack_1f0;
    auVar96._24_8_ = uStack_1e8;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar25,auVar96);
    auVar95._8_8_ = uStack_218;
    auVar95._0_8_ = local_220;
    auVar95._16_8_ = uStack_210;
    auVar95._24_8_ = uStack_208;
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar95,auVar25);
    auVar250._0_4_ = (float)((uint)fVar231 ^ local_7e0) * fVar231;
    auVar250._4_4_ = (float)((uint)fVar237 ^ uStack_7dc) * fVar237;
    auVar250._8_4_ = (float)((uint)fVar232 ^ uStack_7d8) * fVar232;
    auVar250._12_4_ = (float)((uint)fVar236 ^ uStack_7d4) * fVar236;
    auVar250._16_4_ = fStack_7d0 * 0.0;
    auVar250._20_4_ = fStack_7cc * 0.0;
    auVar250._24_4_ = fStack_7c8 * 0.0;
    auVar250._28_4_ = 0;
    auVar32._4_4_ = fVar272 * 4.0;
    auVar32._0_4_ = fVar267 * 4.0;
    auVar32._8_4_ = fVar273 * 4.0;
    auVar32._12_4_ = fVar274 * 4.0;
    auVar32._16_4_ = fVar275 * 4.0;
    auVar32._20_4_ = fVar277 * 4.0;
    fVar110 = auVar271._28_4_;
    auVar32._24_4_ = fVar278 * 4.0;
    auVar32._28_4_ = fVar110;
    auVar121 = vsubps_avx(auVar250,auVar32);
    auVar33._4_4_ = fVar234 * (float)((uint)fVar234 ^ uStack_7dc) * 0.5;
    auVar33._0_4_ = fVar217 * (float)((uint)fVar217 ^ local_7e0) * 0.5;
    auVar33._8_4_ = fVar233 * (float)((uint)fVar233 ^ uStack_7d8) * 0.5;
    auVar33._12_4_ = fVar266 * (float)((uint)fVar266 ^ uStack_7d4) * 0.5;
    auVar33._16_4_ = fVar235 * (float)((uint)fVar235 ^ (uint)fStack_7d0) * 0.5;
    auVar33._20_4_ = fVar284 * (float)((uint)fVar284 ^ (uint)fStack_7cc) * 0.5;
    auVar33._24_4_ = fVar239 * (float)((uint)fVar239 ^ (uint)fStack_7c8) * 0.5;
    auVar33._28_4_ = auVar160._28_4_;
    auVar34._4_4_ = auVar121._4_4_ * 0.5;
    auVar34._0_4_ = auVar121._0_4_ * 0.5;
    auVar34._8_4_ = auVar121._8_4_ * 0.5;
    auVar34._12_4_ = auVar121._12_4_ * 0.5;
    auVar34._16_4_ = auVar121._16_4_ * 0.5;
    auVar34._20_4_ = auVar121._20_4_ * 0.5;
    auVar34._24_4_ = auVar121._24_4_ * 0.5;
    auVar34._28_4_ = auVar121._28_4_;
    auVar35._4_4_ = (fVar272 * 4.0 + fVar234 * fVar234) * 0.5;
    auVar35._0_4_ = (fVar267 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar35._8_4_ = (fVar273 * 4.0 + fVar233 * fVar233) * 0.5;
    auVar35._12_4_ = (fVar274 * 4.0 + fVar266 * fVar266) * 0.5;
    auVar35._16_4_ = (fVar275 * 4.0 + fVar235 * fVar235) * 0.5;
    auVar35._20_4_ = (fVar277 * 4.0 + fVar284 * fVar284) * 0.5;
    auVar35._24_4_ = (fVar278 * 4.0 + fVar239 * fVar239) * 0.5;
    auVar35._28_4_ = fVar110 + auVar255._28_4_;
    fVar217 = fVar231 * fVar231 * 0.5;
    fVar231 = fVar237 * fVar237 * 0.5;
    fVar234 = fVar232 * fVar232 * 0.5;
    fVar237 = fVar236 * fVar236 * 0.5;
    auVar36._4_4_ = fVar231 * fStack_61c;
    auVar36._0_4_ = fVar217 * local_620;
    auVar36._8_4_ = fVar234 * fStack_618;
    auVar36._12_4_ = fVar237 * fStack_614;
    auVar36._16_4_ = fStack_610 * 0.0;
    auVar36._20_4_ = fStack_60c * 0.0;
    auVar36._24_4_ = fStack_608 * 0.0;
    auVar36._28_4_ = fVar110;
    auVar37._4_4_ = fVar231 * local_580._4_4_;
    auVar37._0_4_ = fVar217 * (float)local_580;
    auVar37._8_4_ = fVar234 * (float)uStack_578;
    auVar37._12_4_ = fVar237 * uStack_578._4_4_;
    auVar37._16_4_ = (float)uStack_570 * 0.0;
    auVar37._20_4_ = uStack_570._4_4_ * 0.0;
    auVar37._24_4_ = (float)uStack_568 * 0.0;
    auVar37._28_4_ = uStack_7c4;
    auVar38._4_4_ = fVar231 * local_5a0._4_4_;
    auVar38._0_4_ = fVar217 * (float)local_5a0;
    auVar38._8_4_ = fVar234 * (float)uStack_598;
    auVar38._12_4_ = fVar237 * uStack_598._4_4_;
    auVar38._16_4_ = (float)uStack_590 * 0.0;
    auVar38._20_4_ = uStack_590._4_4_ * 0.0;
    auVar38._24_4_ = (float)uStack_588 * 0.0;
    auVar38._28_4_ = auVar286._28_4_;
    auVar39._4_4_ = fVar231 * local_5c0._4_4_;
    auVar39._0_4_ = fVar217 * (float)local_5c0;
    auVar39._8_4_ = fVar234 * (float)uStack_5b8;
    auVar39._12_4_ = fVar237 * uStack_5b8._4_4_;
    auVar39._16_4_ = (float)uStack_5b0 * 0.0;
    auVar39._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar39._24_4_ = (float)uStack_5a8 * 0.0;
    auVar39._28_4_ = 0;
    auVar78._4_4_ = uStack_5fc;
    auVar78._0_4_ = local_600;
    auVar78._8_4_ = uStack_5f8;
    auVar78._12_4_ = uStack_5f4;
    auVar78._16_4_ = uStack_5f0;
    auVar78._20_4_ = uStack_5ec;
    auVar78._24_4_ = uStack_5e8;
    auVar78._28_4_ = uStack_5e4;
    auVar111 = vfmadd231ps_fma(auVar36,auVar35,auVar78);
    auVar86._8_8_ = uStack_518;
    auVar86._0_8_ = local_520;
    auVar86._16_8_ = uStack_510;
    auVar86._24_8_ = uStack_508;
    auVar167 = vfmadd231ps_fma(auVar37,auVar35,auVar86);
    auVar84._8_8_ = uStack_538;
    auVar84._0_8_ = local_540;
    auVar84._16_8_ = uStack_530;
    auVar84._24_8_ = uStack_528;
    auVar112 = vfmadd231ps_fma(auVar38,auVar35,auVar84);
    auVar82._8_8_ = uStack_558;
    auVar82._0_8_ = local_560;
    auVar82._16_8_ = uStack_550;
    auVar82._24_8_ = uStack_548;
    auVar148 = vfmadd231ps_fma(auVar39,auVar35,auVar82);
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar34,auVar92);
    auVar88._8_8_ = uStack_4f8;
    auVar88._0_8_ = local_500;
    auVar88._16_8_ = uStack_4f0;
    auVar88._24_8_ = uStack_4e8;
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar34,auVar88);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar34,auVar94);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar93,auVar34);
    auVar80._4_4_ = uStack_5dc;
    auVar80._0_4_ = local_5e0;
    auVar80._8_4_ = uStack_5d8;
    auVar80._12_4_ = uStack_5d4;
    auVar80._16_4_ = uStack_5d0;
    auVar80._20_4_ = uStack_5cc;
    auVar80._24_4_ = uStack_5c8;
    auVar80._28_4_ = uStack_5c4;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar33,auVar80);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar33,auVar97);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar33,auVar96);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar95,auVar33);
    auVar269._0_4_ = auVar111._0_4_ * fVar238;
    auVar269._4_4_ = auVar111._4_4_ * fVar238;
    auVar269._8_4_ = auVar111._8_4_ * fVar238;
    auVar269._12_4_ = auVar111._12_4_ * fVar238;
    auVar269._16_4_ = fVar238 * 0.0;
    auVar269._20_4_ = fVar238 * 0.0;
    auVar269._24_4_ = fVar238 * 0.0;
    local_ae0._28_4_ = 0;
    local_ae0._0_28_ = auVar269;
    auVar276._12_4_ = 0;
    auVar276._0_12_ = auVar269._16_12_;
    fVar217 = auVar167._0_4_ * fVar238;
    fVar231 = auVar167._4_4_ * fVar238;
    local_a40._4_4_ = fVar231;
    local_a40._0_4_ = fVar217;
    fVar234 = auVar167._8_4_ * fVar238;
    local_a40._8_4_ = fVar234;
    fVar237 = auVar167._12_4_ * fVar238;
    local_a40._12_4_ = fVar237;
    local_a40._16_4_ = fVar238 * 0.0;
    local_a40._20_4_ = fVar238 * 0.0;
    local_a40._24_4_ = fVar238 * 0.0;
    local_a40._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    fVar144 = auVar112._0_4_ * fVar238;
    fVar145 = auVar112._4_4_ * fVar238;
    local_b00._4_4_ = fVar145;
    local_b00._0_4_ = fVar144;
    fVar146 = auVar112._8_4_ * fVar238;
    local_b00._8_4_ = fVar146;
    fVar147 = auVar112._12_4_ * fVar238;
    local_b00._12_4_ = fVar147;
    fVar165 = fVar238 * 0.0;
    local_b00._16_4_ = fVar165;
    fVar191 = fVar238 * 0.0;
    local_b00._20_4_ = fVar191;
    fVar192 = fVar238 * 0.0;
    local_b00._24_4_ = fVar192;
    local_b00._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar227._0_4_ = fVar238 * auVar148._0_4_;
    auVar227._4_4_ = fVar238 * auVar148._4_4_;
    auVar227._8_4_ = fVar238 * auVar148._8_4_;
    auVar227._12_4_ = fVar238 * auVar148._12_4_;
    auVar227._16_4_ = fVar238 * 0.0;
    auVar227._20_4_ = fVar238 * 0.0;
    auVar227._24_4_ = fVar238 * 0.0;
    auVar227._28_4_ = 0;
    local_b80 = vpermps_avx2(_DAT_01fec480,auVar123);
    local_820 = vpermps_avx2(_DAT_01fec480,local_9c0);
    auVar182 = ZEXT1632(auVar6);
    local_ba0 = vpermps_avx2(_DAT_01fec480,auVar182);
    auVar20 = vsubps_avx(local_b80,auVar123);
    auVar130 = vsubps_avx(local_ba0,ZEXT1632(auVar6));
    fVar236 = auVar130._0_4_;
    fVar235 = auVar130._4_4_;
    auVar40._4_4_ = fVar235 * auVar269._4_4_;
    auVar40._0_4_ = fVar236 * auVar269._0_4_;
    fVar239 = auVar130._8_4_;
    auVar40._8_4_ = fVar239 * auVar269._8_4_;
    fVar110 = auVar130._12_4_;
    auVar40._12_4_ = fVar110 * auVar269._12_4_;
    fVar142 = auVar130._16_4_;
    auVar40._16_4_ = fVar142 * auVar269._16_4_;
    fVar143 = auVar130._20_4_;
    auVar40._20_4_ = fVar143 * auVar269._20_4_;
    fVar193 = auVar130._24_4_;
    auVar40._24_4_ = fVar193 * auVar269._24_4_;
    auVar40._28_4_ = local_b80._28_4_;
    auVar6 = vfmsub231ps_fma(auVar40,local_b00,auVar20);
    auVar21 = vsubps_avx(local_820,local_9c0);
    fVar277 = auVar20._0_4_;
    fVar278 = auVar20._4_4_;
    auVar41._4_4_ = fVar278 * fVar231;
    auVar41._0_4_ = fVar277 * fVar217;
    fVar283 = auVar20._8_4_;
    auVar41._8_4_ = fVar283 * fVar234;
    fVar292 = auVar20._12_4_;
    auVar41._12_4_ = fVar292 * fVar237;
    fVar293 = auVar20._16_4_;
    auVar41._16_4_ = fVar293 * fVar238 * 0.0;
    fVar294 = auVar20._20_4_;
    auVar41._20_4_ = fVar294 * fVar238 * 0.0;
    fVar295 = auVar20._24_4_;
    auVar41._24_4_ = fVar295 * fVar238 * 0.0;
    auVar41._28_4_ = local_ba0._28_4_;
    auVar111 = vfmsub231ps_fma(auVar41,local_ae0,auVar21);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar111._12_4_ * auVar111._12_4_,
                                                CONCAT48(auVar111._8_4_ * auVar111._8_4_,
                                                         CONCAT44(auVar111._4_4_ * auVar111._4_4_,
                                                                  auVar111._0_4_ * auVar111._0_4_)))
                                     ),ZEXT1632(auVar6),ZEXT1632(auVar6));
    fVar284 = auVar21._0_4_;
    fVar238 = auVar21._4_4_;
    auVar42._4_4_ = fVar238 * fVar145;
    auVar42._0_4_ = fVar284 * fVar144;
    fVar267 = auVar21._8_4_;
    auVar42._8_4_ = fVar267 * fVar146;
    fVar272 = auVar21._12_4_;
    auVar42._12_4_ = fVar272 * fVar147;
    fVar273 = auVar21._16_4_;
    auVar42._16_4_ = fVar273 * fVar165;
    fVar274 = auVar21._20_4_;
    auVar42._20_4_ = fVar274 * fVar191;
    fVar275 = auVar21._24_4_;
    auVar42._24_4_ = fVar275 * fVar192;
    auVar42._28_4_ = 0;
    auVar167 = vfmsub231ps_fma(auVar42,local_a40,auVar130);
    auVar210._0_4_ = fVar236 * fVar236;
    auVar210._4_4_ = fVar235 * fVar235;
    auVar210._8_4_ = fVar239 * fVar239;
    auVar210._12_4_ = fVar110 * fVar110;
    auVar210._16_4_ = fVar142 * fVar142;
    auVar210._20_4_ = fVar143 * fVar143;
    auVar210._24_4_ = fVar193 * fVar193;
    auVar210._28_4_ = 0;
    auVar111 = vfmadd231ps_fma(auVar210,auVar21,auVar21);
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar20,auVar20);
    auVar160 = vrcpps_avx(ZEXT1632(auVar111));
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar167),ZEXT1632(auVar167));
    auVar246._8_4_ = 0x3f800000;
    auVar246._0_8_ = 0x3f8000003f800000;
    auVar246._12_4_ = 0x3f800000;
    auVar246._16_4_ = 0x3f800000;
    auVar246._20_4_ = 0x3f800000;
    auVar246._24_4_ = 0x3f800000;
    auVar246._28_4_ = 0x3f800000;
    auVar6 = vfnmadd213ps_fma(auVar160,ZEXT1632(auVar111),auVar246);
    auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar160,auVar160);
    local_aa0 = vpermps_avx2(_DAT_01fec480,local_ae0);
    auVar23 = vpermps_avx2(_DAT_01fec480,local_b00);
    auVar43._4_4_ = fVar235 * local_aa0._4_4_;
    auVar43._0_4_ = fVar236 * local_aa0._0_4_;
    auVar43._8_4_ = fVar239 * local_aa0._8_4_;
    auVar43._12_4_ = fVar110 * local_aa0._12_4_;
    auVar43._16_4_ = fVar142 * local_aa0._16_4_;
    auVar43._20_4_ = fVar143 * local_aa0._20_4_;
    auVar43._24_4_ = fVar193 * local_aa0._24_4_;
    auVar43._28_4_ = auVar160._28_4_;
    auVar112 = vfmsub231ps_fma(auVar43,auVar23,auVar20);
    local_ac0 = vpermps_avx2(_DAT_01fec480,local_a40);
    auVar44._4_4_ = fVar278 * local_ac0._4_4_;
    auVar44._0_4_ = fVar277 * local_ac0._0_4_;
    auVar44._8_4_ = fVar283 * local_ac0._8_4_;
    auVar44._12_4_ = fVar292 * local_ac0._12_4_;
    auVar44._16_4_ = fVar293 * local_ac0._16_4_;
    auVar44._20_4_ = fVar294 * local_ac0._20_4_;
    auVar44._24_4_ = fVar295 * local_ac0._24_4_;
    auVar44._28_4_ = 0;
    auVar148 = vfmsub231ps_fma(auVar44,local_aa0,auVar21);
    auVar112 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar148._12_4_ * auVar148._12_4_,
                                                  CONCAT48(auVar148._8_4_ * auVar148._8_4_,
                                                           CONCAT44(auVar148._4_4_ * auVar148._4_4_,
                                                                    auVar148._0_4_ * auVar148._0_4_)
                                                          ))),ZEXT1632(auVar112),ZEXT1632(auVar112))
    ;
    auVar257._0_4_ = fVar284 * auVar23._0_4_;
    auVar257._4_4_ = fVar238 * auVar23._4_4_;
    auVar257._8_4_ = fVar267 * auVar23._8_4_;
    auVar257._12_4_ = fVar272 * auVar23._12_4_;
    auVar257._16_4_ = fVar273 * auVar23._16_4_;
    auVar257._20_4_ = fVar274 * auVar23._20_4_;
    auVar257._24_4_ = fVar275 * auVar23._24_4_;
    auVar257._28_4_ = 0;
    auVar148 = vfmsub231ps_fma(auVar257,local_ac0,auVar130);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar148),ZEXT1632(auVar148));
    auVar160 = vmaxps_avx(ZEXT1632(CONCAT412(auVar167._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar167._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar167._4_4_ * auVar6._4_4_,
                                                               auVar167._0_4_ * auVar6._0_4_)))),
                          ZEXT1632(CONCAT412(auVar112._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar112._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar112._4_4_ * auVar6._4_4_,
                                                               auVar112._0_4_ * auVar6._0_4_)))));
    auVar245._0_4_ = auVar117._0_4_ + auVar227._0_4_;
    auVar245._4_4_ = auVar117._4_4_ + auVar227._4_4_;
    auVar245._8_4_ = auVar117._8_4_ + auVar227._8_4_;
    auVar245._12_4_ = auVar117._12_4_ + auVar227._12_4_;
    auVar245._16_4_ = auVar227._16_4_ + 0.0;
    auVar245._20_4_ = auVar227._20_4_ + 0.0;
    auVar245._24_4_ = auVar227._24_4_ + 0.0;
    auVar247._28_4_ = 0;
    auVar247._0_28_ = auVar245;
    local_880 = ZEXT1632(auVar117);
    auVar121 = vsubps_avx(local_880,auVar227);
    auVar180 = vpermps_avx2(_DAT_01fec480,auVar121);
    auVar181 = vpermps_avx2(_DAT_01fec480,local_880);
    auVar121 = vmaxps_avx(local_880,auVar247);
    auVar18 = vmaxps_avx(auVar180,auVar181);
    auVar19 = vrsqrtps_avx(ZEXT1632(auVar111));
    auVar121 = vmaxps_avx(auVar121,auVar18);
    fVar217 = auVar19._0_4_;
    fVar231 = auVar19._4_4_;
    fVar234 = auVar19._8_4_;
    fVar237 = auVar19._12_4_;
    fVar233 = auVar19._16_4_;
    fVar232 = auVar19._20_4_;
    fVar266 = auVar19._24_4_;
    auVar45._4_4_ = fVar231 * fVar231 * fVar231 * auVar111._4_4_ * -0.5;
    auVar45._0_4_ = fVar217 * fVar217 * fVar217 * auVar111._0_4_ * -0.5;
    auVar45._8_4_ = fVar234 * fVar234 * fVar234 * auVar111._8_4_ * -0.5;
    auVar45._12_4_ = fVar237 * fVar237 * fVar237 * auVar111._12_4_ * -0.5;
    auVar45._16_4_ = fVar233 * fVar233 * fVar233 * -0.0;
    auVar45._20_4_ = fVar232 * fVar232 * fVar232 * -0.0;
    auVar45._24_4_ = fVar266 * fVar266 * fVar266 * -0.0;
    auVar45._28_4_ = 0;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar6 = vfmadd231ps_fma(auVar45,auVar124,auVar19);
    fVar231 = auVar6._0_4_;
    fVar237 = auVar6._4_4_;
    auVar46._4_4_ = fVar238 * fVar237;
    auVar46._0_4_ = fVar284 * fVar231;
    fVar266 = auVar6._8_4_;
    auVar46._8_4_ = fVar267 * fVar266;
    fVar284 = auVar6._12_4_;
    auVar46._12_4_ = fVar272 * fVar284;
    auVar46._16_4_ = fVar273 * 0.0;
    auVar46._20_4_ = fVar274 * 0.0;
    auVar46._24_4_ = fVar275 * 0.0;
    auVar46._28_4_ = 0;
    auVar47._4_4_ = (float)local_a80._4_4_ * fVar235 * fVar237;
    auVar47._0_4_ = (float)local_a80._0_4_ * fVar236 * fVar231;
    auVar47._8_4_ = fStack_a78 * fVar239 * fVar266;
    auVar47._12_4_ = fStack_a74 * fVar110 * fVar284;
    auVar47._16_4_ = fStack_a70 * fVar142 * 0.0;
    auVar47._20_4_ = fStack_a6c * fVar143 * 0.0;
    auVar47._24_4_ = fStack_a68 * fVar193 * 0.0;
    auVar47._28_4_ = auVar21._28_4_;
    auVar117 = vfmadd231ps_fma(auVar47,auVar46,_local_8a0);
    auVar125 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar18 = vsubps_avx(auVar125,auVar182);
    fVar234 = auVar18._0_4_;
    fVar233 = auVar18._4_4_;
    auVar48._4_4_ = fVar235 * fVar237 * fVar233;
    auVar48._0_4_ = fVar236 * fVar231 * fVar234;
    fVar236 = auVar18._8_4_;
    auVar48._8_4_ = fVar239 * fVar266 * fVar236;
    fVar239 = auVar18._12_4_;
    auVar48._12_4_ = fVar110 * fVar284 * fVar239;
    fVar110 = auVar18._16_4_;
    auVar48._16_4_ = fVar142 * 0.0 * fVar110;
    fVar142 = auVar18._20_4_;
    auVar48._20_4_ = fVar143 * 0.0 * fVar142;
    fVar143 = auVar18._24_4_;
    auVar48._24_4_ = fVar193 * 0.0 * fVar143;
    auVar48._28_4_ = local_ac0._28_4_;
    auVar125 = vsubps_avx(auVar125,local_9c0);
    auVar282 = ZEXT3264(auVar125);
    auVar111 = vfmadd231ps_fma(auVar48,auVar125,auVar46);
    auVar49._4_4_ = fVar278 * fVar237;
    auVar49._0_4_ = fVar277 * fVar231;
    auVar49._8_4_ = fVar283 * fVar266;
    auVar49._12_4_ = fVar292 * fVar284;
    auVar49._16_4_ = fVar293 * 0.0;
    auVar49._20_4_ = fVar294 * 0.0;
    auVar49._24_4_ = fVar295 * 0.0;
    auVar49._28_4_ = 0;
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar49,_local_8c0);
    auVar286 = ZEXT1664(auVar117);
    auVar126 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar22 = vsubps_avx(auVar126,auVar123);
    auVar291 = ZEXT3264(auVar22);
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar22,auVar49);
    auVar50._4_4_ = (float)local_a80._4_4_ * fVar233;
    auVar50._0_4_ = (float)local_a80._0_4_ * fVar234;
    auVar50._8_4_ = fStack_a78 * fVar236;
    auVar50._12_4_ = fStack_a74 * fVar239;
    auVar50._16_4_ = fStack_a70 * fVar110;
    auVar50._20_4_ = fStack_a6c * fVar142;
    auVar50._24_4_ = fStack_a68 * fVar143;
    auVar50._28_4_ = 0;
    auVar167 = vfmadd231ps_fma(auVar50,_local_8a0,auVar125);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),_local_8c0,auVar22);
    fVar217 = auVar111._0_4_;
    fVar274 = auVar117._0_4_;
    fVar232 = auVar111._4_4_;
    fVar275 = auVar117._4_4_;
    fVar235 = auVar111._8_4_;
    fVar277 = auVar117._8_4_;
    fVar238 = auVar111._12_4_;
    fVar278 = auVar117._12_4_;
    auVar51._28_4_ = auVar19._28_4_;
    auVar51._0_28_ =
         ZEXT1628(CONCAT412(fVar278 * fVar238,
                            CONCAT48(fVar277 * fVar235,CONCAT44(fVar275 * fVar232,fVar274 * fVar217)
                                    )));
    auVar156 = vsubps_avx(ZEXT1632(auVar167),auVar51);
    auVar52._4_4_ = fVar233 * fVar233;
    auVar52._0_4_ = fVar234 * fVar234;
    auVar52._8_4_ = fVar236 * fVar236;
    auVar52._12_4_ = fVar239 * fVar239;
    auVar52._16_4_ = fVar110 * fVar110;
    auVar52._20_4_ = fVar142 * fVar142;
    auVar52._24_4_ = fVar143 * fVar143;
    auVar52._28_4_ = auVar19._28_4_;
    auVar167 = vfmadd231ps_fma(auVar52,auVar125,auVar125);
    auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar22,auVar22);
    auVar19 = vsubps_avx(ZEXT1632(auVar167),
                         ZEXT1632(CONCAT412(fVar238 * fVar238,
                                            CONCAT48(fVar235 * fVar235,
                                                     CONCAT44(fVar232 * fVar232,fVar217 * fVar217)))
                                 ));
    auVar18 = vsqrtps_avx(auVar160);
    fVar273 = auVar18._28_4_ + auVar121._28_4_;
    fVar217 = (auVar18._0_4_ + auVar121._0_4_) * 1.0000002;
    fVar232 = (auVar18._4_4_ + auVar121._4_4_) * 1.0000002;
    fVar235 = (auVar18._8_4_ + auVar121._8_4_) * 1.0000002;
    fVar238 = (auVar18._12_4_ + auVar121._12_4_) * 1.0000002;
    fVar193 = (auVar18._16_4_ + auVar121._16_4_) * 1.0000002;
    fVar267 = (auVar18._20_4_ + auVar121._20_4_) * 1.0000002;
    fVar272 = (auVar18._24_4_ + auVar121._24_4_) * 1.0000002;
    auVar53._4_4_ = fVar232 * fVar232;
    auVar53._0_4_ = fVar217 * fVar217;
    auVar53._8_4_ = fVar235 * fVar235;
    auVar53._12_4_ = fVar238 * fVar238;
    auVar53._16_4_ = fVar193 * fVar193;
    auVar53._20_4_ = fVar267 * fVar267;
    auVar53._24_4_ = fVar272 * fVar272;
    auVar53._28_4_ = fVar273;
    local_b40._0_4_ = auVar156._0_4_ + auVar156._0_4_;
    local_b40._4_4_ = auVar156._4_4_ + auVar156._4_4_;
    local_b40._8_4_ = auVar156._8_4_ + auVar156._8_4_;
    local_b40._12_4_ = auVar156._12_4_ + auVar156._12_4_;
    local_b40._16_4_ = auVar156._16_4_ + auVar156._16_4_;
    local_b40._20_4_ = auVar156._20_4_ + auVar156._20_4_;
    local_b40._24_4_ = auVar156._24_4_ + auVar156._24_4_;
    fVar217 = auVar156._28_4_;
    local_b40._28_4_ = fVar217 + fVar217;
    auVar121 = vsubps_avx(auVar19,auVar53);
    auVar256 = ZEXT1632(auVar117);
    auVar54._28_4_ = 0x3f800002;
    auVar54._0_28_ =
         ZEXT1628(CONCAT412(fVar278 * fVar278,
                            CONCAT48(fVar277 * fVar277,CONCAT44(fVar275 * fVar275,fVar274 * fVar274)
                                    )));
    local_900 = vsubps_avx(local_280,auVar54);
    auVar271 = ZEXT3264(local_900);
    auVar55._4_4_ = local_b40._4_4_ * local_b40._4_4_;
    auVar55._0_4_ = (float)local_b40._0_4_ * (float)local_b40._0_4_;
    auVar55._8_4_ = local_b40._8_4_ * local_b40._8_4_;
    auVar55._12_4_ = local_b40._12_4_ * local_b40._12_4_;
    auVar55._16_4_ = local_b40._16_4_ * local_b40._16_4_;
    auVar55._20_4_ = local_b40._20_4_ * local_b40._20_4_;
    auVar55._24_4_ = local_b40._24_4_ * local_b40._24_4_;
    auVar55._28_4_ = fVar273;
    fVar232 = local_900._0_4_;
    fVar235 = local_900._4_4_;
    fVar238 = local_900._8_4_;
    fVar193 = local_900._12_4_;
    fVar267 = local_900._16_4_;
    fVar272 = local_900._20_4_;
    fVar273 = local_900._24_4_;
    auVar56._4_4_ = fVar235 * 4.0 * auVar121._4_4_;
    auVar56._0_4_ = fVar232 * 4.0 * auVar121._0_4_;
    auVar56._8_4_ = fVar238 * 4.0 * auVar121._8_4_;
    auVar56._12_4_ = fVar193 * 4.0 * auVar121._12_4_;
    auVar56._16_4_ = fVar267 * 4.0 * auVar121._16_4_;
    auVar56._20_4_ = fVar272 * 4.0 * auVar121._20_4_;
    auVar56._24_4_ = fVar273 * 4.0 * auVar121._24_4_;
    auVar56._28_4_ = fVar217;
    auVar156 = vsubps_avx(auVar55,auVar56);
    auVar160 = vcmpps_avx(auVar156,auVar126,5);
    auVar270 = ZEXT1632(auVar111);
    fVar217 = local_900._28_4_;
    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar160 >> 0x7f,0) == '\0') &&
          (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar160 >> 0xbf,0) == '\0') &&
        (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar160[0x1f])
    {
      auVar255 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar211._8_4_ = 0xff800000;
      auVar211._0_8_ = 0xff800000ff800000;
      auVar211._12_4_ = 0xff800000;
      auVar211._16_4_ = 0xff800000;
      auVar211._20_4_ = 0xff800000;
      auVar211._24_4_ = 0xff800000;
      auVar211._28_4_ = 0xff800000;
    }
    else {
      auVar296 = vsqrtps_avx(auVar156);
      auVar297._0_4_ = fVar232 + fVar232;
      auVar297._4_4_ = fVar235 + fVar235;
      auVar297._8_4_ = fVar238 + fVar238;
      auVar297._12_4_ = fVar193 + fVar193;
      auVar297._16_4_ = fVar267 + fVar267;
      auVar297._20_4_ = fVar272 + fVar272;
      auVar297._24_4_ = fVar273 + fVar273;
      auVar297._28_4_ = fVar217 + fVar217;
      auVar229 = vrcpps_avx(auVar297);
      auVar126 = vcmpps_avx(auVar156,auVar126,5);
      auVar127._8_4_ = 0x3f800000;
      auVar127._0_8_ = 0x3f8000003f800000;
      auVar127._12_4_ = 0x3f800000;
      auVar127._16_4_ = 0x3f800000;
      auVar127._20_4_ = 0x3f800000;
      auVar127._24_4_ = 0x3f800000;
      auVar127._28_4_ = 0x3f800000;
      auVar117 = vfnmadd213ps_fma(auVar297,auVar229,auVar127);
      auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar229,auVar229);
      auVar212._0_4_ = local_b40._0_4_ ^ local_7e0;
      auVar212._4_4_ = (uint)local_b40._4_4_ ^ uStack_7dc;
      auVar212._8_4_ = (uint)local_b40._8_4_ ^ uStack_7d8;
      auVar212._12_4_ = (uint)local_b40._12_4_ ^ uStack_7d4;
      auVar212._16_4_ = (uint)local_b40._16_4_ ^ (uint)fStack_7d0;
      auVar212._20_4_ = (uint)local_b40._20_4_ ^ (uint)fStack_7cc;
      auVar212._24_4_ = (uint)local_b40._24_4_ ^ (uint)fStack_7c8;
      auVar212._28_4_ = (uint)local_b40._28_4_ ^ uStack_7c4;
      auVar156 = vsubps_avx(auVar212,auVar296);
      auVar57._4_4_ = auVar117._4_4_ * auVar156._4_4_;
      auVar57._0_4_ = auVar117._0_4_ * auVar156._0_4_;
      auVar57._8_4_ = auVar117._8_4_ * auVar156._8_4_;
      auVar57._12_4_ = auVar117._12_4_ * auVar156._12_4_;
      auVar57._16_4_ = auVar156._16_4_ * 0.0;
      auVar57._20_4_ = auVar156._20_4_ * 0.0;
      auVar57._24_4_ = auVar156._24_4_ * 0.0;
      auVar57._28_4_ = auVar156._28_4_;
      auVar156 = vsubps_avx(auVar296,local_b40);
      auVar58._4_4_ = auVar117._4_4_ * auVar156._4_4_;
      auVar58._0_4_ = auVar117._0_4_ * auVar156._0_4_;
      auVar58._8_4_ = auVar117._8_4_ * auVar156._8_4_;
      auVar58._12_4_ = auVar117._12_4_ * auVar156._12_4_;
      auVar58._16_4_ = auVar156._16_4_ * 0.0;
      auVar58._20_4_ = auVar156._20_4_ * 0.0;
      auVar58._24_4_ = auVar156._24_4_ * 0.0;
      auVar58._28_4_ = auVar156._28_4_;
      auVar117 = vfmadd213ps_fma(auVar256,auVar57,auVar270);
      local_300 = auVar117._0_4_ * fVar231;
      fStack_2fc = auVar117._4_4_ * fVar237;
      fStack_2f8 = auVar117._8_4_ * fVar266;
      fStack_2f4 = auVar117._12_4_ * fVar284;
      uStack_2f0 = 0;
      uStack_2ec = 0;
      uStack_2e8 = 0;
      uStack_2e4 = 0x3f800000;
      auVar156 = vandps_avx(local_920,auVar54);
      auVar156 = vmaxps_avx(local_640,auVar156);
      auVar59._4_4_ = auVar156._4_4_ * 1.9073486e-06;
      auVar59._0_4_ = auVar156._0_4_ * 1.9073486e-06;
      auVar59._8_4_ = auVar156._8_4_ * 1.9073486e-06;
      auVar59._12_4_ = auVar156._12_4_ * 1.9073486e-06;
      auVar59._16_4_ = auVar156._16_4_ * 1.9073486e-06;
      auVar59._20_4_ = auVar156._20_4_ * 1.9073486e-06;
      auVar59._24_4_ = auVar156._24_4_ * 1.9073486e-06;
      auVar59._28_4_ = auVar156._28_4_;
      auVar156 = vandps_avx(local_900,local_920);
      auVar229 = vcmpps_avx(auVar156,auVar59,1);
      auVar117 = vfmadd213ps_fma(auVar256,auVar58,auVar270);
      auVar128._8_4_ = 0x7f800000;
      auVar128._0_8_ = 0x7f8000007f800000;
      auVar128._12_4_ = 0x7f800000;
      auVar128._16_4_ = 0x7f800000;
      auVar128._20_4_ = 0x7f800000;
      auVar128._24_4_ = 0x7f800000;
      auVar128._28_4_ = 0x7f800000;
      auVar156 = vblendvps_avx(auVar128,auVar57,auVar126);
      local_320 = auVar117._0_4_ * fVar231;
      fStack_31c = auVar117._4_4_ * fVar237;
      fStack_318 = auVar117._8_4_ * fVar266;
      fStack_314 = auVar117._12_4_ * fVar284;
      uStack_310 = 0;
      uStack_30c = 0;
      uStack_308 = 0;
      uStack_304 = auVar156._28_4_;
      auVar129._8_4_ = 0xff800000;
      auVar129._0_8_ = 0xff800000ff800000;
      auVar129._12_4_ = 0xff800000;
      auVar129._16_4_ = 0xff800000;
      auVar129._20_4_ = 0xff800000;
      auVar129._24_4_ = 0xff800000;
      auVar129._28_4_ = 0xff800000;
      auVar211 = vblendvps_avx(auVar129,auVar58,auVar126);
      auVar296 = auVar126 & auVar229;
      if ((((((((auVar296 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar296 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar296 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar296 >> 0x7f,0) == '\0') &&
            (auVar296 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar296 >> 0xbf,0) == '\0') &&
          (auVar296 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar296[0x1f]) {
        auVar255 = ZEXT3264(auVar156);
      }
      else {
        auVar160 = vandps_avx(auVar229,auVar126);
        auVar229 = vcmpps_avx(auVar121,_DAT_01faff00,2);
        auVar139._8_4_ = 0xff800000;
        auVar139._0_8_ = 0xff800000ff800000;
        auVar139._12_4_ = 0xff800000;
        auVar139._16_4_ = 0xff800000;
        auVar139._20_4_ = 0xff800000;
        auVar139._24_4_ = 0xff800000;
        auVar139._28_4_ = 0xff800000;
        auVar163._8_4_ = 0x7f800000;
        auVar163._0_8_ = 0x7f8000007f800000;
        auVar163._12_4_ = 0x7f800000;
        auVar163._16_4_ = 0x7f800000;
        auVar163._20_4_ = 0x7f800000;
        auVar163._24_4_ = 0x7f800000;
        auVar163._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar163,auVar139,auVar229);
        auVar117 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
        auVar296 = vpmovsxwd_avx2(auVar117);
        auVar121 = vblendvps_avx(auVar156,auVar121,auVar296);
        auVar156 = vblendvps_avx(auVar139,auVar163,auVar229);
        auVar211 = vblendvps_avx(auVar211,auVar156,auVar296);
        auVar230._0_8_ = auVar160._0_8_ ^ 0xffffffffffffffff;
        auVar230._8_4_ = auVar160._8_4_ ^ 0xffffffff;
        auVar230._12_4_ = auVar160._12_4_ ^ 0xffffffff;
        auVar230._16_4_ = auVar160._16_4_ ^ 0xffffffff;
        auVar230._20_4_ = auVar160._20_4_ ^ 0xffffffff;
        auVar230._24_4_ = auVar160._24_4_ ^ 0xffffffff;
        auVar230._28_4_ = auVar160._28_4_ ^ 0xffffffff;
        auVar160 = vorps_avx(auVar229,auVar230);
        auVar255 = ZEXT3264(auVar121);
        auVar160 = vandps_avx(auVar126,auVar160);
      }
    }
    auVar121 = local_7c0 & auVar160;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar121 >> 0x7f,0) != '\0') ||
          (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar121 >> 0xbf,0) != '\0') ||
        (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar121[0x1f] < '\0') {
      local_340 = ZEXT1632(auVar6);
      fVar274 = *(float *)(ray + k * 4 + 0x100);
      local_6c0 = ZEXT416((uint)fVar274);
      fVar275 = fVar274 - (float)local_980._0_4_;
      auVar228._4_4_ = fVar275;
      auVar228._0_4_ = fVar275;
      auVar228._8_4_ = fVar275;
      auVar228._12_4_ = fVar275;
      auVar228._16_4_ = fVar275;
      auVar228._20_4_ = fVar275;
      auVar228._24_4_ = fVar275;
      auVar228._28_4_ = fVar275;
      auVar126 = vminps_avx(auVar228,auVar211);
      auVar60._4_4_ = fVar145 * fVar233;
      auVar60._0_4_ = fVar144 * fVar234;
      auVar60._8_4_ = fVar146 * fVar236;
      auVar60._12_4_ = fVar147 * fVar239;
      auVar60._16_4_ = fVar165 * fVar110;
      auVar60._20_4_ = fVar191 * fVar142;
      auVar60._24_4_ = fVar192 * fVar143;
      auVar60._28_4_ = fVar275;
      auVar6 = vfmadd213ps_fma(auVar125,local_a40,auVar60);
      auVar91._4_4_ = fStack_2bc;
      auVar91._0_4_ = local_2c0;
      auVar91._8_4_ = fStack_2b8;
      auVar91._12_4_ = fStack_2b4;
      auVar91._16_4_ = fStack_2b0;
      auVar91._20_4_ = fStack_2ac;
      auVar91._24_4_ = fStack_2a8;
      auVar91._28_4_ = fStack_2a4;
      auVar156 = vmaxps_avx(auVar91,auVar255._0_32_);
      auVar117 = vfmadd213ps_fma(auVar22,local_ae0,ZEXT1632(auVar6));
      auVar282._0_4_ = fVar144 * (float)local_a80._0_4_;
      auVar282._4_4_ = fVar145 * (float)local_a80._4_4_;
      auVar282._8_4_ = fVar146 * fStack_a78;
      auVar282._12_4_ = fVar147 * fStack_a74;
      auVar282._16_4_ = fVar165 * fStack_a70;
      auVar282._20_4_ = fVar191 * fStack_a6c;
      auVar282._28_36_ = auVar255._28_36_;
      auVar282._24_4_ = fVar192 * fStack_a68;
      auVar271 = ZEXT3264(_local_8a0);
      auVar6 = vfmadd231ps_fma(auVar282._0_32_,_local_8a0,local_a40);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_8c0,local_ae0);
      auVar121 = vandps_avx(local_920,ZEXT1632(auVar111));
      auVar258._8_4_ = 0x219392ef;
      auVar258._0_8_ = 0x219392ef219392ef;
      auVar258._12_4_ = 0x219392ef;
      auVar258._16_4_ = 0x219392ef;
      auVar258._20_4_ = 0x219392ef;
      auVar258._24_4_ = 0x219392ef;
      auVar258._28_4_ = 0x219392ef;
      auVar125 = vcmpps_avx(auVar121,auVar258,1);
      auVar121 = vrcpps_avx(ZEXT1632(auVar111));
      auVar298._8_4_ = 0x3f800000;
      auVar298._0_8_ = 0x3f8000003f800000;
      auVar298._12_4_ = 0x3f800000;
      auVar298._16_4_ = 0x3f800000;
      auVar298._20_4_ = 0x3f800000;
      auVar298._24_4_ = 0x3f800000;
      auVar298._28_4_ = 0x3f800000;
      auVar229 = ZEXT1632(auVar111);
      auVar6 = vfnmadd213ps_fma(auVar121,auVar229,auVar298);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar121,auVar121);
      auVar299._0_4_ = auVar111._0_4_ ^ local_7e0;
      auVar299._4_4_ = auVar111._4_4_ ^ uStack_7dc;
      auVar299._8_4_ = auVar111._8_4_ ^ uStack_7d8;
      auVar299._12_4_ = auVar111._12_4_ ^ uStack_7d4;
      auVar299._16_4_ = fStack_7d0;
      auVar299._20_4_ = fStack_7cc;
      auVar299._24_4_ = fStack_7c8;
      auVar299._28_4_ = uStack_7c4;
      auVar61._4_4_ = auVar6._4_4_ * (float)(auVar117._4_4_ ^ uStack_7dc);
      auVar61._0_4_ = auVar6._0_4_ * (float)(auVar117._0_4_ ^ local_7e0);
      auVar61._8_4_ = auVar6._8_4_ * (float)(auVar117._8_4_ ^ uStack_7d8);
      auVar61._12_4_ = auVar6._12_4_ * (float)(auVar117._12_4_ ^ uStack_7d4);
      auVar61._16_4_ = fStack_7d0 * 0.0;
      auVar61._20_4_ = fStack_7cc * 0.0;
      auVar61._24_4_ = fStack_7c8 * 0.0;
      auVar61._28_4_ = uStack_7c4;
      auVar121 = vcmpps_avx(auVar229,auVar299,1);
      auVar121 = vorps_avx(auVar125,auVar121);
      auVar288._8_4_ = 0xff800000;
      auVar288._0_8_ = 0xff800000ff800000;
      auVar288._12_4_ = 0xff800000;
      auVar288._16_4_ = 0xff800000;
      auVar288._20_4_ = 0xff800000;
      auVar288._24_4_ = 0xff800000;
      auVar288._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar61,auVar288,auVar121);
      auVar22 = vmaxps_avx(auVar156,auVar121);
      auVar121 = vcmpps_avx(auVar229,auVar299,6);
      auVar121 = vorps_avx(auVar125,auVar121);
      auVar300._8_4_ = 0x7f800000;
      auVar300._0_8_ = 0x7f8000007f800000;
      auVar300._12_4_ = 0x7f800000;
      auVar300._16_4_ = 0x7f800000;
      auVar300._20_4_ = 0x7f800000;
      auVar300._24_4_ = 0x7f800000;
      auVar300._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar61,auVar300,auVar121);
      auVar156 = vminps_avx(auVar126,auVar121);
      local_b20._28_4_ = auVar23._28_4_;
      fVar234 = (float)(local_7e0 ^ (uint)auVar23._0_4_);
      fVar233 = (float)(uStack_7dc ^ (uint)auVar23._4_4_);
      fVar236 = (float)(uStack_7d8 ^ (uint)auVar23._8_4_);
      fVar239 = (float)(uStack_7d4 ^ (uint)auVar23._12_4_);
      fVar110 = (float)((uint)fStack_7d0 ^ (uint)auVar23._16_4_);
      fVar142 = (float)((uint)fStack_7cc ^ (uint)auVar23._20_4_);
      fVar143 = (float)((uint)fStack_7c8 ^ (uint)auVar23._24_4_);
      auVar253._0_4_ = local_7e0 ^ (uint)local_ac0._0_4_;
      auVar253._4_4_ = uStack_7dc ^ (uint)local_ac0._4_4_;
      auVar253._8_4_ = uStack_7d8 ^ (uint)local_ac0._8_4_;
      auVar253._12_4_ = uStack_7d4 ^ (uint)local_ac0._12_4_;
      auVar253._16_4_ = (uint)fStack_7d0 ^ (uint)local_ac0._16_4_;
      auVar253._20_4_ = (uint)fStack_7cc ^ (uint)local_ac0._20_4_;
      auVar253._24_4_ = (uint)fStack_7c8 ^ (uint)local_ac0._24_4_;
      auVar253._28_4_ = uStack_7c4 ^ local_ac0._28_4_;
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar125 = vsubps_avx(ZEXT832(0) << 0x20,local_ba0);
      auVar62._4_4_ = auVar125._4_4_ * fVar233;
      auVar62._0_4_ = auVar125._0_4_ * fVar234;
      auVar62._8_4_ = auVar125._8_4_ * fVar236;
      auVar62._12_4_ = auVar125._12_4_ * fVar239;
      auVar62._16_4_ = auVar125._16_4_ * fVar110;
      auVar62._20_4_ = auVar125._20_4_ * fVar142;
      auVar62._24_4_ = auVar125._24_4_ * fVar143;
      auVar62._28_4_ = auVar125._28_4_;
      auVar6 = vfmadd231ps_fma(auVar62,auVar253,auVar121);
      auVar259._0_4_ = local_7e0 ^ (uint)local_aa0._0_4_;
      auVar259._4_4_ = uStack_7dc ^ (uint)local_aa0._4_4_;
      auVar259._8_4_ = uStack_7d8 ^ (uint)local_aa0._8_4_;
      auVar259._12_4_ = uStack_7d4 ^ (uint)local_aa0._12_4_;
      auVar259._16_4_ = (uint)fStack_7d0 ^ (uint)local_aa0._16_4_;
      auVar259._20_4_ = (uint)fStack_7cc ^ (uint)local_aa0._20_4_;
      auVar259._24_4_ = (uint)fStack_7c8 ^ (uint)local_aa0._24_4_;
      auVar259._28_4_ = uStack_7c4 ^ local_aa0._28_4_;
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,local_b80);
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar259,auVar121);
      auVar63._4_4_ = fVar233 * (float)local_a80._4_4_;
      auVar63._0_4_ = fVar234 * (float)local_a80._0_4_;
      auVar63._8_4_ = fVar236 * fStack_a78;
      auVar63._12_4_ = fVar239 * fStack_a74;
      auVar63._16_4_ = fVar110 * fStack_a70;
      auVar63._20_4_ = fVar142 * fStack_a6c;
      auVar63._24_4_ = fVar143 * fStack_a68;
      auVar63._28_4_ = uStack_7c4 ^ local_b20._28_4_;
      auVar6 = vfmadd231ps_fma(auVar63,_local_8a0,auVar253);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_8c0,auVar259);
      auVar121 = vandps_avx(local_920,ZEXT1632(auVar111));
      auVar302._8_4_ = 0x3f800000;
      auVar302._0_8_ = 0x3f8000003f800000;
      auVar302._12_4_ = 0x3f800000;
      auVar302._16_4_ = 0x3f800000;
      auVar302._20_4_ = 0x3f800000;
      auVar302._24_4_ = 0x3f800000;
      auVar302._28_4_ = 0x3f800000;
      auVar126 = vrcpps_avx(ZEXT1632(auVar111));
      auVar213._8_4_ = 0x219392ef;
      auVar213._0_8_ = 0x219392ef219392ef;
      auVar213._12_4_ = 0x219392ef;
      auVar213._16_4_ = 0x219392ef;
      auVar213._20_4_ = 0x219392ef;
      auVar213._24_4_ = 0x219392ef;
      auVar213._28_4_ = 0x219392ef;
      auVar125 = vcmpps_avx(auVar121,auVar213,1);
      auVar255 = ZEXT3264(auVar125);
      auVar229 = ZEXT1632(auVar111);
      auVar6 = vfnmadd213ps_fma(auVar126,auVar229,auVar302);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar126,auVar126);
      auVar260._0_4_ = auVar111._0_4_ ^ local_7e0;
      auVar260._4_4_ = auVar111._4_4_ ^ uStack_7dc;
      auVar260._8_4_ = auVar111._8_4_ ^ uStack_7d8;
      auVar260._12_4_ = auVar111._12_4_ ^ uStack_7d4;
      auVar260._16_4_ = fStack_7d0;
      auVar260._20_4_ = fStack_7cc;
      auVar260._24_4_ = fStack_7c8;
      auVar260._28_4_ = uStack_7c4;
      auVar64._4_4_ = auVar6._4_4_ * (float)(auVar117._4_4_ ^ uStack_7dc);
      auVar64._0_4_ = auVar6._0_4_ * (float)(auVar117._0_4_ ^ local_7e0);
      auVar64._8_4_ = auVar6._8_4_ * (float)(auVar117._8_4_ ^ uStack_7d8);
      auVar64._12_4_ = auVar6._12_4_ * (float)(auVar117._12_4_ ^ uStack_7d4);
      auVar64._16_4_ = fStack_7d0 * 0.0;
      auVar64._20_4_ = fStack_7cc * 0.0;
      auVar64._24_4_ = fStack_7c8 * 0.0;
      auVar64._28_4_ = uStack_7c4;
      auVar282 = ZEXT3264(auVar64);
      auVar121 = vcmpps_avx(auVar229,auVar260,1);
      auVar121 = vorps_avx(auVar121,auVar125);
      auVar155._8_4_ = 0xff800000;
      auVar155._0_8_ = 0xff800000ff800000;
      auVar155._12_4_ = 0xff800000;
      auVar155._16_4_ = 0xff800000;
      auVar155._20_4_ = 0xff800000;
      auVar155._24_4_ = 0xff800000;
      auVar155._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar64,auVar155,auVar121);
      auVar291 = ZEXT3264(auVar121);
      _local_a00 = vmaxps_avx(auVar22,auVar121);
      auVar121 = vcmpps_avx(auVar229,auVar260,6);
      auVar121 = vorps_avx(auVar125,auVar121);
      auVar214._8_4_ = 0x7f800000;
      auVar214._0_8_ = 0x7f8000007f800000;
      auVar214._12_4_ = 0x7f800000;
      auVar214._16_4_ = 0x7f800000;
      auVar214._20_4_ = 0x7f800000;
      auVar214._24_4_ = 0x7f800000;
      auVar214._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar64,auVar214,auVar121);
      auVar160 = vandps_avx(local_7c0,auVar160);
      local_360 = vminps_avx(auVar156,auVar121);
      auVar121 = vcmpps_avx(_local_a00,local_360,2);
      auVar125 = auVar160 & auVar121;
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0x7f,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar125 >> 0xbf,0) != '\0') ||
          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar125[0x1f] < '\0') {
        auVar90._4_4_ = fStack_2fc;
        auVar90._0_4_ = local_300;
        auVar90._8_4_ = fStack_2f8;
        auVar90._12_4_ = fStack_2f4;
        auVar90._16_4_ = uStack_2f0;
        auVar90._20_4_ = uStack_2ec;
        auVar90._24_4_ = uStack_2e8;
        auVar90._28_4_ = uStack_2e4;
        auVar125 = vminps_avx(auVar90,auVar302);
        auVar291 = ZEXT864(0) << 0x20;
        auVar125 = vmaxps_avx(auVar125,ZEXT832(0) << 0x20);
        auVar89._4_4_ = fStack_31c;
        auVar89._0_4_ = local_320;
        auVar89._8_4_ = fStack_318;
        auVar89._12_4_ = fStack_314;
        auVar89._16_4_ = uStack_310;
        auVar89._20_4_ = uStack_30c;
        auVar89._24_4_ = uStack_308;
        auVar89._28_4_ = uStack_304;
        auVar22 = vminps_avx(auVar89,auVar302);
        auVar22 = vmaxps_avx(auVar22,ZEXT832(0) << 0x20);
        auVar65._4_4_ = (auVar125._4_4_ + 1.0) * 0.125;
        auVar65._0_4_ = (auVar125._0_4_ + 0.0) * 0.125;
        auVar65._8_4_ = (auVar125._8_4_ + 2.0) * 0.125;
        auVar65._12_4_ = (auVar125._12_4_ + 3.0) * 0.125;
        auVar65._16_4_ = (auVar125._16_4_ + 4.0) * 0.125;
        auVar65._20_4_ = (auVar125._20_4_ + 5.0) * 0.125;
        auVar65._24_4_ = (auVar125._24_4_ + 6.0) * 0.125;
        auVar65._28_4_ = auVar125._28_4_ + 7.0;
        auVar6 = vfmadd213ps_fma(auVar65,local_860,local_840);
        auVar66._4_4_ = (auVar22._4_4_ + 1.0) * 0.125;
        auVar66._0_4_ = (auVar22._0_4_ + 0.0) * 0.125;
        auVar66._8_4_ = (auVar22._8_4_ + 2.0) * 0.125;
        auVar66._12_4_ = (auVar22._12_4_ + 3.0) * 0.125;
        auVar66._16_4_ = (auVar22._16_4_ + 4.0) * 0.125;
        auVar66._20_4_ = (auVar22._20_4_ + 5.0) * 0.125;
        auVar66._24_4_ = (auVar22._24_4_ + 6.0) * 0.125;
        auVar66._28_4_ = auVar22._28_4_ + 7.0;
        auVar117 = vfmadd213ps_fma(auVar66,local_860,local_840);
        auVar156 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar125 = vminps_avx(local_880,auVar247);
        auVar22 = vminps_avx(auVar180,auVar181);
        auVar125 = vminps_avx(auVar125,auVar22);
        auVar18 = vsubps_avx(auVar125,auVar18);
        auVar160 = vandps_avx(auVar121,auVar160);
        local_1a0 = ZEXT1632(auVar6);
        local_1c0 = ZEXT1632(auVar117);
        auVar67._4_4_ = auVar18._4_4_ * 0.99999976;
        auVar67._0_4_ = auVar18._0_4_ * 0.99999976;
        auVar67._8_4_ = auVar18._8_4_ * 0.99999976;
        auVar67._12_4_ = auVar18._12_4_ * 0.99999976;
        auVar67._16_4_ = auVar18._16_4_ * 0.99999976;
        auVar67._20_4_ = auVar18._20_4_ * 0.99999976;
        auVar67._24_4_ = auVar18._24_4_ * 0.99999976;
        auVar67._28_4_ = auVar18._28_4_;
        auVar121 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar67);
        auVar68._4_4_ = auVar121._4_4_ * auVar121._4_4_;
        auVar68._0_4_ = auVar121._0_4_ * auVar121._0_4_;
        auVar68._8_4_ = auVar121._8_4_ * auVar121._8_4_;
        auVar68._12_4_ = auVar121._12_4_ * auVar121._12_4_;
        auVar68._16_4_ = auVar121._16_4_ * auVar121._16_4_;
        auVar68._20_4_ = auVar121._20_4_ * auVar121._20_4_;
        auVar68._24_4_ = auVar121._24_4_ * auVar121._24_4_;
        auVar68._28_4_ = auVar121._28_4_;
        auVar18 = vsubps_avx(auVar19,auVar68);
        auVar69._4_4_ = fVar235 * 4.0 * auVar18._4_4_;
        auVar69._0_4_ = fVar232 * 4.0 * auVar18._0_4_;
        auVar69._8_4_ = fVar238 * 4.0 * auVar18._8_4_;
        auVar69._12_4_ = fVar193 * 4.0 * auVar18._12_4_;
        auVar69._16_4_ = fVar267 * 4.0 * auVar18._16_4_;
        auVar69._20_4_ = fVar272 * 4.0 * auVar18._20_4_;
        auVar69._24_4_ = fVar273 * 4.0 * auVar18._24_4_;
        auVar69._28_4_ = auVar121._28_4_;
        auVar19 = vsubps_avx(auVar55,auVar69);
        auVar282 = ZEXT3264(auVar19);
        auVar121 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,5);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) {
          auVar130 = SUB6432(ZEXT864(0),0) << 0x20;
          local_960 = ZEXT832(0) << 0x20;
          _local_800 = ZEXT832(0) << 0x20;
          auVar189 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          local_940 = local_960;
        }
        else {
          auVar22 = vsqrtps_avx(auVar19);
          auVar262._0_4_ = fVar232 + fVar232;
          auVar262._4_4_ = fVar235 + fVar235;
          auVar262._8_4_ = fVar238 + fVar238;
          auVar262._12_4_ = fVar193 + fVar193;
          auVar262._16_4_ = fVar267 + fVar267;
          auVar262._20_4_ = fVar272 + fVar272;
          auVar262._24_4_ = fVar273 + fVar273;
          auVar262._28_4_ = fVar217 + fVar217;
          auVar125 = vrcpps_avx(auVar262);
          auVar6 = vfnmadd213ps_fma(auVar262,auVar125,auVar302);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar125,auVar125);
          auVar289._0_4_ = local_b40._0_4_ ^ local_7e0;
          auVar289._4_4_ = (uint)local_b40._4_4_ ^ uStack_7dc;
          auVar289._8_4_ = (uint)local_b40._8_4_ ^ uStack_7d8;
          auVar289._12_4_ = (uint)local_b40._12_4_ ^ uStack_7d4;
          auVar289._16_4_ = (uint)local_b40._16_4_ ^ (uint)fStack_7d0;
          auVar289._20_4_ = (uint)local_b40._20_4_ ^ (uint)fStack_7cc;
          auVar289._24_4_ = (uint)local_b40._24_4_ ^ (uint)fStack_7c8;
          auVar289._28_4_ = (uint)local_b40._28_4_ ^ uStack_7c4;
          auVar125 = vsubps_avx(auVar289,auVar22);
          auVar156 = vsubps_avx(auVar22,local_b40);
          fVar217 = auVar125._0_4_ * auVar6._0_4_;
          fVar234 = auVar125._4_4_ * auVar6._4_4_;
          auVar70._4_4_ = fVar234;
          auVar70._0_4_ = fVar217;
          fVar233 = auVar125._8_4_ * auVar6._8_4_;
          auVar70._8_4_ = fVar233;
          fVar232 = auVar125._12_4_ * auVar6._12_4_;
          auVar70._12_4_ = fVar232;
          fVar236 = auVar125._16_4_ * 0.0;
          auVar70._16_4_ = fVar236;
          fVar235 = auVar125._20_4_ * 0.0;
          auVar70._20_4_ = fVar235;
          fVar239 = auVar125._24_4_ * 0.0;
          auVar70._24_4_ = fVar239;
          auVar70._28_4_ = auVar22._28_4_;
          fVar238 = auVar6._0_4_ * auVar156._0_4_;
          fVar110 = auVar6._4_4_ * auVar156._4_4_;
          auVar71._4_4_ = fVar110;
          auVar71._0_4_ = fVar238;
          fVar142 = auVar6._8_4_ * auVar156._8_4_;
          auVar71._8_4_ = fVar142;
          fVar143 = auVar6._12_4_ * auVar156._12_4_;
          auVar71._12_4_ = fVar143;
          fVar144 = auVar156._16_4_ * 0.0;
          auVar71._16_4_ = fVar144;
          fVar145 = auVar156._20_4_ * 0.0;
          auVar71._20_4_ = fVar145;
          fVar146 = auVar156._24_4_ * 0.0;
          auVar71._24_4_ = fVar146;
          auVar71._28_4_ = auVar125._28_4_;
          auVar291 = ZEXT3264(auVar71);
          auVar6 = vfmadd213ps_fma(auVar256,auVar70,auVar270);
          auVar117 = vfmadd213ps_fma(auVar256,auVar71,auVar270);
          auVar125 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar284,
                                        CONCAT48(auVar6._8_4_ * fVar266,
                                                 CONCAT44(auVar6._4_4_ * fVar237,
                                                          auVar6._0_4_ * fVar231))));
          auVar72._28_4_ = local_8a0._28_4_;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(auVar117._12_4_ * fVar284,
                                  CONCAT48(auVar117._8_4_ * fVar266,
                                           CONCAT44(auVar117._4_4_ * fVar237,
                                                    auVar117._0_4_ * fVar231))));
          auVar6 = vfmadd213ps_fma(auVar20,auVar125,auVar123);
          auVar117 = vfmadd213ps_fma(auVar20,auVar72,auVar123);
          auVar111 = vfmadd213ps_fma(auVar21,auVar125,local_9c0);
          auVar167 = vfmadd213ps_fma(auVar21,auVar72,local_9c0);
          auVar112 = vfmadd213ps_fma(auVar125,auVar130,auVar182);
          auVar148 = vfmadd213ps_fma(auVar130,auVar72,auVar182);
          auVar73._4_4_ = (float)local_8c0._4_4_ * fVar234;
          auVar73._0_4_ = (float)local_8c0._0_4_ * fVar217;
          auVar73._8_4_ = fStack_8b8 * fVar233;
          auVar73._12_4_ = fStack_8b4 * fVar232;
          auVar73._16_4_ = fStack_8b0 * fVar236;
          auVar73._20_4_ = fStack_8ac * fVar235;
          auVar73._24_4_ = fStack_8a8 * fVar239;
          auVar73._28_4_ = 0;
          auVar130 = vsubps_avx(auVar73,ZEXT1632(auVar6));
          auVar157._0_4_ = (float)local_8a0._0_4_ * fVar217;
          auVar157._4_4_ = (float)local_8a0._4_4_ * fVar234;
          auVar157._8_4_ = fStack_898 * fVar233;
          auVar157._12_4_ = fStack_894 * fVar232;
          auVar157._16_4_ = fStack_890 * fVar236;
          auVar157._20_4_ = fStack_88c * fVar235;
          auVar157._24_4_ = fStack_888 * fVar239;
          auVar157._28_4_ = 0;
          auVar156 = vsubps_avx(auVar157,ZEXT1632(auVar111));
          auVar183._0_4_ = (float)local_a80._0_4_ * fVar217;
          auVar183._4_4_ = (float)local_a80._4_4_ * fVar234;
          auVar183._8_4_ = fStack_a78 * fVar233;
          auVar183._12_4_ = fStack_a74 * fVar232;
          auVar183._16_4_ = fStack_a70 * fVar236;
          auVar183._20_4_ = fStack_a6c * fVar235;
          auVar183._24_4_ = fStack_a68 * fVar239;
          auVar183._28_4_ = 0;
          auVar20 = vsubps_avx(auVar183,ZEXT1632(auVar112));
          auVar189 = ZEXT3264(auVar20);
          auVar263._0_4_ = (float)local_8c0._0_4_ * fVar238;
          auVar263._4_4_ = (float)local_8c0._4_4_ * fVar110;
          auVar263._8_4_ = fStack_8b8 * fVar142;
          auVar263._12_4_ = fStack_8b4 * fVar143;
          auVar263._16_4_ = fStack_8b0 * fVar144;
          auVar263._20_4_ = fStack_8ac * fVar145;
          auVar263._24_4_ = fStack_8a8 * fVar146;
          auVar263._28_4_ = 0;
          local_940 = vsubps_avx(auVar263,ZEXT1632(auVar117));
          auVar74._4_4_ = (float)local_8a0._4_4_ * fVar110;
          auVar74._0_4_ = (float)local_8a0._0_4_ * fVar238;
          auVar74._8_4_ = fStack_898 * fVar142;
          auVar74._12_4_ = fStack_894 * fVar143;
          auVar74._16_4_ = fStack_890 * fVar144;
          auVar74._20_4_ = fStack_88c * fVar145;
          auVar74._24_4_ = fStack_888 * fVar146;
          auVar74._28_4_ = local_940._28_4_;
          local_960 = vsubps_avx(auVar74,ZEXT1632(auVar167));
          auVar75._4_4_ = (float)local_a80._4_4_ * fVar110;
          auVar75._0_4_ = (float)local_a80._0_4_ * fVar238;
          auVar75._8_4_ = fStack_a78 * fVar142;
          auVar75._12_4_ = fStack_a74 * fVar143;
          auVar75._16_4_ = fStack_a70 * fVar144;
          auVar75._20_4_ = fStack_a6c * fVar145;
          auVar75._24_4_ = fStack_a68 * fVar146;
          auVar75._28_4_ = local_960._28_4_;
          _local_800 = vsubps_avx(auVar75,ZEXT1632(auVar148));
          auVar286 = ZEXT864(0) << 0x20;
          auVar20 = vcmpps_avx(auVar19,_DAT_01faff00,5);
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar254 = vblendvps_avx(auVar264,auVar70,auVar20);
          auVar19 = vandps_avx(local_920,auVar54);
          auVar19 = vmaxps_avx(local_640,auVar19);
          auVar76._4_4_ = auVar19._4_4_ * 1.9073486e-06;
          auVar76._0_4_ = auVar19._0_4_ * 1.9073486e-06;
          auVar76._8_4_ = auVar19._8_4_ * 1.9073486e-06;
          auVar76._12_4_ = auVar19._12_4_ * 1.9073486e-06;
          auVar76._16_4_ = auVar19._16_4_ * 1.9073486e-06;
          auVar76._20_4_ = auVar19._20_4_ * 1.9073486e-06;
          auVar76._24_4_ = auVar19._24_4_ * 1.9073486e-06;
          auVar76._28_4_ = auVar19._28_4_;
          auVar19 = vandps_avx(local_920,local_900);
          auVar19 = vcmpps_avx(auVar19,auVar76,1);
          auVar282 = ZEXT3264(auVar19);
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar261 = vblendvps_avx(auVar265,auVar71,auVar20);
          auVar21 = auVar20 & auVar19;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            auVar121 = vandps_avx(auVar19,auVar20);
            auVar19 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
            auVar290._8_4_ = 0xff800000;
            auVar290._0_8_ = 0xff800000ff800000;
            auVar290._12_4_ = 0xff800000;
            auVar290._16_4_ = 0xff800000;
            auVar290._20_4_ = 0xff800000;
            auVar290._24_4_ = 0xff800000;
            auVar290._28_4_ = 0xff800000;
            auVar291 = ZEXT3264(auVar290);
            auVar301._8_4_ = 0x7f800000;
            auVar301._0_8_ = 0x7f8000007f800000;
            auVar301._12_4_ = 0x7f800000;
            auVar301._16_4_ = 0x7f800000;
            auVar301._20_4_ = 0x7f800000;
            auVar301._24_4_ = 0x7f800000;
            auVar301._28_4_ = 0x7f800000;
            auVar18 = vblendvps_avx(auVar301,auVar290,auVar19);
            auVar6 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar21 = vpmovsxwd_avx2(auVar6);
            auVar282 = ZEXT3264(auVar21);
            auVar254 = vblendvps_avx(auVar254,auVar18,auVar21);
            auVar18 = vblendvps_avx(auVar290,auVar301,auVar19);
            auVar286 = ZEXT3264(auVar18);
            auVar261 = vblendvps_avx(auVar261,auVar18,auVar21);
            auVar248._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
            auVar248._8_4_ = auVar121._8_4_ ^ 0xffffffff;
            auVar248._12_4_ = auVar121._12_4_ ^ 0xffffffff;
            auVar248._16_4_ = auVar121._16_4_ ^ 0xffffffff;
            auVar248._20_4_ = auVar121._20_4_ ^ 0xffffffff;
            auVar248._24_4_ = auVar121._24_4_ ^ 0xffffffff;
            auVar248._28_4_ = auVar121._28_4_ ^ 0xffffffff;
            auVar121 = vorps_avx(auVar19,auVar248);
            auVar121 = vandps_avx(auVar20,auVar121);
          }
        }
        auVar271 = ZEXT3264(_local_a00);
        local_4e0 = _local_a00;
        local_4c0 = vminps_avx(local_360,auVar254);
        local_b20 = vmaxps_avx(_local_a00,auVar261);
        local_380 = local_b20;
        auVar18 = vcmpps_avx(_local_a00,local_4c0,2);
        local_720 = vandps_avx(auVar18,auVar160);
        auVar18 = vcmpps_avx(local_b20,local_360,2);
        local_7a0 = vandps_avx(auVar18,auVar160);
        auVar255 = ZEXT3264(local_7a0);
        auVar160 = vorps_avx(local_7a0,local_720);
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar160[0x1f] < '\0') {
          local_760._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
          local_760._8_4_ = auVar121._8_4_ ^ 0xffffffff;
          local_760._12_4_ = auVar121._12_4_ ^ 0xffffffff;
          local_760._16_4_ = auVar121._16_4_ ^ 0xffffffff;
          local_760._20_4_ = auVar121._20_4_ ^ 0xffffffff;
          local_760._24_4_ = auVar121._24_4_ ^ 0xffffffff;
          local_760._28_4_ = auVar121._28_4_ ^ 0xffffffff;
          auVar190._0_4_ = (float)local_a80._0_4_ * auVar189._0_4_;
          auVar190._4_4_ = (float)local_a80._4_4_ * auVar189._4_4_;
          auVar190._8_4_ = fStack_a78 * auVar189._8_4_;
          auVar190._12_4_ = fStack_a74 * auVar189._12_4_;
          auVar190._16_4_ = fStack_a70 * auVar189._16_4_;
          auVar190._20_4_ = fStack_a6c * auVar189._20_4_;
          auVar190._28_36_ = auVar189._28_36_;
          auVar190._24_4_ = fStack_a68 * auVar189._24_4_;
          auVar6 = vfmadd213ps_fma(auVar156,_local_8a0,auVar190._0_32_);
          auVar6 = vfmadd213ps_fma(auVar130,_local_8c0,ZEXT1632(auVar6));
          auVar160 = vandps_avx(ZEXT1632(auVar6),local_920);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar160 = vcmpps_avx(auVar160,auVar158,1);
          auVar160 = vorps_avx(auVar160,local_760);
          auVar159._8_4_ = 3;
          auVar159._0_8_ = 0x300000003;
          auVar159._12_4_ = 3;
          auVar159._16_4_ = 3;
          auVar159._20_4_ = 3;
          auVar159._24_4_ = 3;
          auVar159._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar160 = vblendvps_avx(auVar184,auVar159,auVar160);
          local_780._4_4_ = iVar99;
          local_780._0_4_ = iVar99;
          local_780._8_4_ = iVar99;
          local_780._12_4_ = iVar99;
          local_780._16_4_ = iVar99;
          local_780._20_4_ = iVar99;
          local_780._24_4_ = iVar99;
          local_780._28_4_ = iVar99;
          local_740 = vpcmpgtd_avx2(auVar160,local_780);
          local_6e0 = vpandn_avx2(local_740,local_720);
          auVar189 = ZEXT3264(local_6e0);
          auVar160 = local_720 & ~local_740;
          fStack_c0c = auVar5._4_4_;
          fStack_c08 = auVar5._8_4_;
          fStack_c04 = auVar5._12_4_;
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar160 >> 0x7f,0) == '\0') &&
                (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0xbf,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar160[0x1f]) {
            auVar131._4_4_ = fVar274;
            auVar131._0_4_ = fVar274;
            auVar131._8_4_ = fVar274;
            auVar131._12_4_ = fVar274;
            auVar131._16_4_ = fVar274;
            auVar131._20_4_ = fVar274;
            auVar131._24_4_ = fVar274;
            auVar131._28_4_ = fVar274;
            auVar160 = local_b20;
            fVar217 = (float)local_a80._0_4_;
            fVar234 = (float)local_a80._4_4_;
            fVar233 = fStack_a78;
            fVar232 = fStack_a74;
            fVar266 = fStack_a70;
            fVar236 = fStack_a6c;
            fVar235 = fStack_a68;
            local_b20 = auVar23;
            local_7a0 = auVar54;
            local_ae0._16_16_ = auVar276;
            local_880._16_16_ = (undefined1  [16])0x0;
          }
          else {
            auVar117 = vminps_avx(auVar2,auVar4);
            auVar6 = vmaxps_avx(auVar2,auVar4);
            auVar111 = vminps_avx(auVar3,auVar5);
            auVar167 = vminps_avx(auVar117,auVar111);
            auVar117 = vmaxps_avx(auVar3,auVar5);
            auVar111 = vmaxps_avx(auVar6,auVar117);
            auVar194._8_4_ = 0x7fffffff;
            auVar194._0_8_ = 0x7fffffff7fffffff;
            auVar194._12_4_ = 0x7fffffff;
            auVar6 = vandps_avx(auVar167,auVar194);
            local_b00._0_16_ = auVar194;
            auVar117 = vandps_avx(auVar111,auVar194);
            auVar6 = vmaxps_avx(auVar6,auVar117);
            auVar117 = vmovshdup_avx(auVar6);
            auVar117 = vmaxss_avx(auVar117,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar117);
            local_9c0 = ZEXT1632(CONCAT124(auVar7._4_12_,auVar6._0_4_ * 1.9073486e-06));
            local_9e0._0_16_ = vshufps_avx(auVar111,auVar111,0xff);
            local_9e0._16_12_ = auVar245._16_12_;
            local_9e0._28_4_ = 0;
            local_8e0._4_4_ = (float)local_a00._4_4_ + (float)local_a60._4_4_;
            local_8e0._0_4_ = (float)local_a00._0_4_ + (float)local_a60._0_4_;
            fStack_8d8 = fStack_9f8 + fStack_a58;
            fStack_8d4 = fStack_9f4 + fStack_a54;
            fStack_8d0 = fStack_9f0 + fStack_a50;
            fStack_8cc = fStack_9ec + fStack_a4c;
            fStack_8c8 = fStack_9e8 + fStack_a48;
            fStack_8c4 = fStack_9e4 + fStack_a44;
            do {
              auVar132._8_4_ = 0x7f800000;
              auVar132._0_8_ = 0x7f8000007f800000;
              auVar132._12_4_ = 0x7f800000;
              auVar132._16_4_ = 0x7f800000;
              auVar132._20_4_ = 0x7f800000;
              auVar132._24_4_ = 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar160 = auVar189._0_32_;
              auVar121 = vblendvps_avx(auVar132,_local_a00,auVar160);
              auVar18 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar18 = vminps_avx(auVar121,auVar18);
              auVar19 = vshufpd_avx(auVar18,auVar18,5);
              auVar18 = vminps_avx(auVar18,auVar19);
              auVar19 = vpermpd_avx2(auVar18,0x4e);
              auVar18 = vminps_avx(auVar18,auVar19);
              auVar121 = vcmpps_avx(auVar121,auVar18,0);
              auVar18 = auVar160 & auVar121;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar121,auVar160);
              }
              uVar101 = vmovmskps_avx(auVar160);
              iVar24 = 0;
              for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar102 = iVar24 << 2;
              *(undefined4 *)(local_6e0 + uVar102) = 0;
              uVar101 = *(uint *)(local_1a0 + uVar102);
              uVar102 = *(uint *)(local_4e0 + uVar102);
              fVar217 = auVar16._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar217 = sqrtf((float)local_a20._0_4_);
              }
              local_aa0._0_4_ = fVar217 * 1.9073486e-06;
              auVar6 = vinsertps_avx(ZEXT416(uVar102),ZEXT416(uVar101),0x10);
              auVar271 = ZEXT1664(auVar6);
              lVar107 = 5;
              do {
                auVar167 = auVar271._0_16_;
                local_b80._0_16_ = vmovshdup_avx(auVar167);
                fVar231 = local_b80._0_4_;
                fVar232 = 1.0 - fVar231;
                fVar237 = fVar232 * fVar232 * fVar232;
                fVar233 = fVar231 * fVar231;
                fVar234 = fVar231 * fVar233;
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                         ZEXT416((uint)fVar234));
                fVar217 = fVar231 * fVar232;
                auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar217 * 6.0)),
                                           ZEXT416((uint)(fVar232 * fVar217)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar217 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar231 * fVar217)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar234),
                                         ZEXT416((uint)fVar237));
                fVar231 = (auVar6._0_4_ + auVar111._0_4_) * 0.16666667;
                fVar234 = fVar234 * 0.16666667;
                auVar149._0_4_ = fVar234 * fVar141;
                auVar149._4_4_ = fVar234 * fStack_c0c;
                auVar149._8_4_ = fVar234 * fStack_c08;
                auVar149._12_4_ = fVar234 * fStack_c04;
                auVar195._4_4_ = fVar231;
                auVar195._0_4_ = fVar231;
                auVar195._8_4_ = fVar231;
                auVar195._12_4_ = fVar231;
                auVar6 = vfmadd132ps_fma(auVar195,auVar149,auVar3);
                fVar231 = (auVar7._0_4_ + auVar117._0_4_) * 0.16666667;
                auVar150._4_4_ = fVar231;
                auVar150._0_4_ = fVar231;
                auVar150._8_4_ = fVar231;
                auVar150._12_4_ = fVar231;
                auVar6 = vfmadd132ps_fma(auVar150,auVar6,auVar4);
                fVar234 = auVar271._0_4_;
                auVar169._4_4_ = fVar234;
                auVar169._0_4_ = fVar234;
                auVar169._8_4_ = fVar234;
                auVar169._12_4_ = fVar234;
                auVar7 = vfmadd213ps_fma(auVar169,local_a10,_DAT_01f7aa10);
                fVar237 = fVar237 * 0.16666667;
                auVar113._4_4_ = fVar237;
                auVar113._0_4_ = fVar237;
                auVar113._8_4_ = fVar237;
                auVar113._12_4_ = fVar237;
                auVar6 = vfmadd132ps_fma(auVar113,auVar6,auVar2);
                local_820._0_16_ = auVar6;
                auVar7 = vsubps_avx(auVar7,auVar6);
                auVar6 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar231 = auVar6._0_4_;
                if (fVar231 < 0.0) {
                  local_ba0._0_16_ = ZEXT416((uint)fVar232);
                  local_ae0._0_4_ = fVar233;
                  local_a40._0_4_ = fVar217;
                  auVar286._0_4_ = sqrtf(fVar231);
                  auVar286._4_60_ = extraout_var;
                  auVar117 = auVar286._0_16_;
                  fVar233 = (float)local_ae0._0_4_;
                  auVar111 = local_ba0._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar6,auVar6);
                  local_a40._0_4_ = fVar217;
                  auVar111 = ZEXT416((uint)fVar232);
                }
                fVar217 = auVar111._0_4_;
                auVar114._4_4_ = fVar217;
                auVar114._0_4_ = fVar217;
                auVar114._8_4_ = fVar217;
                auVar114._12_4_ = fVar217;
                auVar148 = vfnmsub213ss_fma(local_b80._0_16_,local_b80._0_16_,
                                            ZEXT416((uint)((float)local_a40._0_4_ * 4.0)));
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ * 4.0)),auVar111,
                                           auVar111);
                fVar217 = fVar217 * -fVar217 * 0.5;
                fVar237 = auVar148._0_4_ * 0.5;
                fVar232 = auVar112._0_4_ * 0.5;
                fVar233 = fVar233 * 0.5;
                auVar241._0_4_ = fVar141 * fVar233;
                auVar241._4_4_ = fStack_c0c * fVar233;
                auVar241._8_4_ = fStack_c08 * fVar233;
                auVar241._12_4_ = fStack_c04 * fVar233;
                auVar196._4_4_ = fVar232;
                auVar196._0_4_ = fVar232;
                auVar196._8_4_ = fVar232;
                auVar196._12_4_ = fVar232;
                auVar112 = vfmadd213ps_fma(auVar196,auVar3,auVar241);
                auVar219._4_4_ = fVar237;
                auVar219._0_4_ = fVar237;
                auVar219._8_4_ = fVar237;
                auVar219._12_4_ = fVar237;
                auVar112 = vfmadd213ps_fma(auVar219,auVar4,auVar112);
                auVar280._4_4_ = fVar217;
                auVar280._0_4_ = fVar217;
                auVar280._8_4_ = fVar217;
                auVar280._12_4_ = fVar217;
                auVar168 = vfmadd213ps_fma(auVar280,auVar2,auVar112);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar111,local_b80._0_16_)
                ;
                auVar148 = vfmadd213ss_fma(local_b80._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar111)
                ;
                auVar111 = vshufps_avx(auVar167,auVar167,0x55);
                auVar197._0_4_ = fVar141 * auVar111._0_4_;
                auVar197._4_4_ = fStack_c0c * auVar111._4_4_;
                auVar197._8_4_ = fStack_c08 * auVar111._8_4_;
                auVar197._12_4_ = fStack_c04 * auVar111._12_4_;
                uVar109 = auVar148._0_4_;
                auVar220._4_4_ = uVar109;
                auVar220._0_4_ = uVar109;
                auVar220._8_4_ = uVar109;
                auVar220._12_4_ = uVar109;
                auVar111 = vfmadd213ps_fma(auVar220,auVar3,auVar197);
                auVar170._0_4_ = auVar112._0_4_;
                auVar170._4_4_ = auVar170._0_4_;
                auVar170._8_4_ = auVar170._0_4_;
                auVar170._12_4_ = auVar170._0_4_;
                auVar111 = vfmadd213ps_fma(auVar170,auVar4,auVar111);
                auVar177 = vfmadd231ps_fma(auVar111,auVar2,auVar114);
                auVar112 = vdpps_avx(auVar168,auVar168,0x7f);
                auVar111 = vblendps_avx(auVar112,_DAT_01f7aa10,0xe);
                auVar148 = vrsqrtss_avx(auVar111,auVar111);
                fVar217 = auVar148._0_4_;
                fVar233 = auVar112._0_4_;
                fVar217 = fVar217 * 1.5 + fVar233 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar148 = vdpps_avx(auVar168,auVar177,0x7f);
                auVar171._0_4_ = auVar177._0_4_ * fVar233;
                auVar171._4_4_ = auVar177._4_4_ * fVar233;
                auVar171._8_4_ = auVar177._8_4_ * fVar233;
                auVar171._12_4_ = auVar177._12_4_ * fVar233;
                fVar237 = auVar148._0_4_;
                auVar242._0_4_ = auVar168._0_4_ * fVar237;
                auVar242._4_4_ = auVar168._4_4_ * fVar237;
                fVar232 = auVar168._8_4_;
                auVar242._8_4_ = fVar232 * fVar237;
                fVar266 = auVar168._12_4_;
                auVar242._12_4_ = fVar266 * fVar237;
                auVar148 = vsubps_avx(auVar171,auVar242);
                auVar111 = vrcpss_avx(auVar111,auVar111);
                auVar177 = vfnmadd213ss_fma(auVar111,auVar112,ZEXT416(0x40000000));
                fVar237 = auVar111._0_4_ * auVar177._0_4_;
                auVar111 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(fVar234 * (float)local_aa0._0_4_)));
                auVar291 = ZEXT1664(auVar111);
                local_a40._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                local_a40._8_4_ = -fVar232;
                local_a40._12_4_ = -fVar266;
                auVar198._0_4_ = fVar217 * auVar148._0_4_ * fVar237;
                auVar198._4_4_ = fVar217 * auVar148._4_4_ * fVar237;
                auVar198._8_4_ = fVar217 * auVar148._8_4_ * fVar237;
                auVar198._12_4_ = fVar217 * auVar148._12_4_ * fVar237;
                auVar251._0_4_ = auVar168._0_4_ * fVar217;
                auVar251._4_4_ = auVar168._4_4_ * fVar217;
                auVar251._8_4_ = fVar232 * fVar217;
                auVar251._12_4_ = fVar266 * fVar217;
                local_b80._0_16_ = auVar168;
                local_ba0._0_4_ = auVar111._0_4_;
                if (fVar233 < -fVar233) {
                  local_ae0._0_4_ = auVar117._0_4_;
                  local_ac0._0_16_ = auVar251;
                  local_b40._0_16_ = auVar198;
                  fVar217 = sqrtf(fVar233);
                  auVar291 = ZEXT464((uint)local_ba0._0_4_);
                  auVar117 = ZEXT416((uint)local_ae0._0_4_);
                  auVar198 = local_b40._0_16_;
                  auVar251 = local_ac0._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar112,auVar112);
                  fVar217 = auVar111._0_4_;
                }
                auVar111 = vdpps_avx(auVar7,auVar251,0x7f);
                auVar168 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar117,auVar291._0_16_);
                auVar112 = vdpps_avx(local_a40._0_16_,auVar251,0x7f);
                auVar148 = vdpps_avx(auVar7,auVar198,0x7f);
                local_ae0._0_16_ = vdpps_avx(local_a10,auVar251,0x7f);
                auVar168 = vfmadd213ss_fma(ZEXT416((uint)(auVar117._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9c0._0_4_ / fVar217)),
                                           auVar168);
                auVar286 = ZEXT1664(auVar168);
                fVar217 = auVar112._0_4_ + auVar148._0_4_;
                auVar115._0_4_ = auVar111._0_4_ * auVar111._0_4_;
                auVar115._4_4_ = auVar111._4_4_ * auVar111._4_4_;
                auVar115._8_4_ = auVar111._8_4_ * auVar111._8_4_;
                auVar115._12_4_ = auVar111._12_4_ * auVar111._12_4_;
                auVar117 = vdpps_avx(auVar7,local_a40._0_16_,0x7f);
                auVar148 = vsubps_avx(auVar6,auVar115);
                auVar112 = vrsqrtss_avx(auVar148,auVar148);
                fVar237 = auVar148._0_4_;
                fVar234 = auVar112._0_4_;
                fVar234 = fVar234 * 1.5 + fVar237 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar112 = vdpps_avx(auVar7,local_a10,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar117,auVar111,ZEXT416((uint)fVar217));
                auVar117 = vfnmadd231ss_fma(auVar112,auVar111,local_ae0._0_16_);
                if (fVar237 < 0.0) {
                  local_ac0._0_16_ = auVar111;
                  local_b40._0_4_ = auVar168._0_4_;
                  local_840._0_16_ = ZEXT416((uint)fVar217);
                  local_860._0_4_ = fVar234;
                  local_880._0_16_ = auVar117;
                  fVar237 = sqrtf(fVar237);
                  auVar286 = ZEXT464((uint)local_b40._0_4_);
                  auVar291 = ZEXT464((uint)local_ba0._0_4_);
                  fVar234 = (float)local_860._0_4_;
                  auVar117 = local_880._0_16_;
                  auVar111 = local_ac0._0_16_;
                  auVar112 = local_840._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar148,auVar148);
                  fVar237 = auVar112._0_4_;
                  auVar112 = ZEXT416((uint)fVar217);
                }
                auVar282 = ZEXT1664(local_b80._0_16_);
                auVar148 = vpermilps_avx(local_820._0_16_,0xff);
                fVar237 = fVar237 - auVar148._0_4_;
                auVar148 = vshufps_avx(local_b80._0_16_,local_b80._0_16_,0xff);
                auVar168 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar234),auVar148);
                auVar199._0_8_ = local_ae0._0_8_ ^ 0x8000000080000000;
                auVar199._8_4_ = local_ae0._8_4_ ^ 0x80000000;
                auVar199._12_4_ = local_ae0._12_4_ ^ 0x80000000;
                auVar221._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                auVar221._8_4_ = auVar168._8_4_ ^ 0x80000000;
                auVar221._12_4_ = auVar168._12_4_ ^ 0x80000000;
                auVar117 = ZEXT416((uint)(auVar117._0_4_ * fVar234));
                auVar168 = vfmsub231ss_fma(ZEXT416((uint)(auVar168._0_4_ * local_ae0._0_4_)),
                                           auVar112,auVar117);
                auVar117 = vinsertps_avx(auVar221,auVar117,0x1c);
                uVar109 = auVar168._0_4_;
                auVar222._4_4_ = uVar109;
                auVar222._0_4_ = uVar109;
                auVar222._8_4_ = uVar109;
                auVar222._12_4_ = uVar109;
                auVar117 = vdivps_avx(auVar117,auVar222);
                auVar112 = vinsertps_avx(auVar112,auVar199,0x10);
                auVar112 = vdivps_avx(auVar112,auVar222);
                fVar217 = auVar111._0_4_;
                auVar172._0_4_ = fVar217 * auVar117._0_4_ + fVar237 * auVar112._0_4_;
                auVar172._4_4_ = fVar217 * auVar117._4_4_ + fVar237 * auVar112._4_4_;
                auVar172._8_4_ = fVar217 * auVar117._8_4_ + fVar237 * auVar112._8_4_;
                auVar172._12_4_ = fVar217 * auVar117._12_4_ + fVar237 * auVar112._12_4_;
                auVar167 = vsubps_avx(auVar167,auVar172);
                auVar271 = ZEXT1664(auVar167);
                auVar117 = vandps_avx(auVar111,local_b00._0_16_);
                fVar217 = (float)local_a80._0_4_;
                fVar234 = (float)local_a80._4_4_;
                fVar233 = fStack_a78;
                fVar232 = fStack_a74;
                fVar266 = fStack_a70;
                fVar236 = fStack_a6c;
                fVar235 = fStack_a68;
                if (auVar117._0_4_ < auVar286._0_4_) {
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(auVar291._0_4_ + auVar286._0_4_)),
                                             local_9e0._0_16_,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar237),local_b00._0_16_);
                  if (auVar117._0_4_ < auVar111._0_4_) {
                    fVar237 = auVar167._0_4_ + (float)local_980._0_4_;
                    if (fVar237 < fVar108) break;
                    fVar284 = *(float *)(ray + k * 4 + 0x100);
                    auVar286 = ZEXT464((uint)fVar284);
                    if (fVar284 < fVar237) break;
                    auVar117 = vmovshdup_avx(auVar167);
                    fVar239 = auVar117._0_4_;
                    if ((fVar239 < 0.0) || (1.0 < fVar239)) break;
                    auVar6 = vrsqrtss_avx(auVar6,auVar6);
                    fVar238 = auVar6._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar98].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar231 = fVar238 * 1.5 + fVar231 * -0.5 * fVar238 * fVar238 * fVar238;
                    local_c40 = auVar7._0_4_;
                    fStack_c3c = auVar7._4_4_;
                    fStack_c38 = auVar7._8_4_;
                    fStack_c34 = auVar7._12_4_;
                    auVar200._0_4_ = fVar231 * local_c40;
                    auVar200._4_4_ = fVar231 * fStack_c3c;
                    auVar200._8_4_ = fVar231 * fStack_c38;
                    auVar200._12_4_ = fVar231 * fStack_c34;
                    auVar112 = vfmadd213ps_fma(auVar148,auVar200,local_b80._0_16_);
                    auVar6 = vshufps_avx(auVar200,auVar200,0xc9);
                    auVar7 = vshufps_avx(local_b80._0_16_,local_b80._0_16_,0xc9);
                    auVar201._0_4_ = auVar200._0_4_ * auVar7._0_4_;
                    auVar201._4_4_ = auVar200._4_4_ * auVar7._4_4_;
                    auVar201._8_4_ = auVar200._8_4_ * auVar7._8_4_;
                    auVar201._12_4_ = auVar200._12_4_ * auVar7._12_4_;
                    auVar111 = vfmsub231ps_fma(auVar201,local_b80._0_16_,auVar6);
                    auVar6 = vshufps_avx(auVar111,auVar111,0xc9);
                    auVar7 = vshufps_avx(auVar112,auVar112,0xc9);
                    auVar111 = vshufps_avx(auVar111,auVar111,0xd2);
                    auVar151._0_4_ = auVar112._0_4_ * auVar111._0_4_;
                    auVar151._4_4_ = auVar112._4_4_ * auVar111._4_4_;
                    auVar151._8_4_ = auVar112._8_4_ * auVar111._8_4_;
                    auVar151._12_4_ = auVar112._12_4_ * auVar111._12_4_;
                    auVar6 = vfmsub231ps_fma(auVar151,auVar6,auVar7);
                    uVar109 = auVar6._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar237;
                      uVar9 = vextractps_avx(auVar6,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar6,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar109;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar239;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_b48;
                      *(uint *)(ray + k * 4 + 0x240) = uVar98;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar14 = context->user;
                    local_440 = auVar117._0_8_;
                    auVar7 = vmovshdup_avx(auVar6);
                    local_4a0._8_8_ = auVar7._0_8_;
                    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
                    local_480 = auVar6._0_8_;
                    local_4a0._0_8_ = local_4a0._8_8_;
                    local_4a0._16_8_ = local_4a0._8_8_;
                    local_4a0._24_8_ = local_4a0._8_8_;
                    uStack_478 = local_480;
                    uStack_470 = local_480;
                    uStack_468 = local_480;
                    local_460 = uVar109;
                    uStack_45c = uVar109;
                    uStack_458 = uVar109;
                    uStack_454 = uVar109;
                    uStack_450 = uVar109;
                    uStack_44c = uVar109;
                    uStack_448 = uVar109;
                    uStack_444 = uVar109;
                    uStack_438 = local_440;
                    uStack_430 = local_440;
                    uStack_428 = local_440;
                    auVar173._12_4_ = 0;
                    auVar173._0_12_ = ZEXT812(0);
                    auVar173 = auVar173 << 0x20;
                    local_420 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_400 = CONCAT44(uStack_67c,local_680);
                    uStack_3f8 = CONCAT44(uStack_674,uStack_678);
                    uStack_3f0 = CONCAT44(uStack_66c,uStack_670);
                    uStack_3e8 = CONCAT44(uStack_664,uStack_668);
                    local_3e0._4_4_ = uStack_65c;
                    local_3e0._0_4_ = local_660;
                    local_3e0._8_4_ = uStack_658;
                    local_3e0._12_4_ = uStack_654;
                    local_3e0._16_4_ = uStack_650;
                    local_3e0._20_4_ = uStack_64c;
                    local_3e0._24_4_ = uStack_648;
                    local_3e0._28_4_ = uStack_644;
                    auVar160 = vpcmpeqd_avx2(local_3e0,local_3e0);
                    local_b50[1] = auVar160;
                    *local_b50 = auVar160;
                    local_3c0 = pRVar14->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = pRVar14->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar237;
                    local_9a0 = local_6a0;
                    local_bd0.valid = (int *)local_9a0;
                    local_bd0.geometryUserPtr = pGVar10->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = (RTCHitN *)local_4a0;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar271 = ZEXT1664(auVar167);
                      auVar282 = ZEXT1664(local_b80._0_16_);
                      auVar291 = ZEXT1664(auVar291._0_16_);
                      (*pGVar10->intersectionFilterN)(&local_bd0);
                      auVar173 = ZEXT816(0) << 0x40;
                    }
                    auVar121 = ZEXT1632(auVar173);
                    auVar160 = vpcmpeqd_avx2(local_9a0,auVar121);
                    auVar160 = _DAT_01fe9960 & ~auVar160;
                    fVar217 = (float)local_a80._0_4_;
                    fVar234 = (float)local_a80._4_4_;
                    fVar233 = fStack_a78;
                    fVar232 = fStack_a74;
                    fVar266 = fStack_a70;
                    fVar236 = fStack_a6c;
                    fVar235 = fStack_a68;
                    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar160 >> 0x7f,0) != '\0') ||
                          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar160 >> 0xbf,0) != '\0') ||
                        (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar160[0x1f] < '\0') {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar291 = ZEXT1664(auVar291._0_16_);
                        (*p_Var15)(&local_bd0);
                        auVar121 = ZEXT832(0) << 0x40;
                        fVar217 = (float)local_a80._0_4_;
                        fVar234 = (float)local_a80._4_4_;
                        fVar233 = fStack_a78;
                        fVar232 = fStack_a74;
                        fVar266 = fStack_a70;
                        fVar236 = fStack_a6c;
                        fVar235 = fStack_a68;
                      }
                      auVar286 = ZEXT464((uint)fVar284);
                      auVar121 = vpcmpeqd_avx2(local_9a0,auVar121);
                      auVar160 = _DAT_01fe9960 & ~auVar121;
                      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar160 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar160 >> 0x7f,0) != '\0') ||
                            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar160 >> 0xbf,0) != '\0') ||
                          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar160[0x1f] < '\0') {
                        auVar133._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
                        auVar133._8_4_ = auVar121._8_4_ ^ 0xffffffff;
                        auVar133._12_4_ = auVar121._12_4_ ^ 0xffffffff;
                        auVar133._16_4_ = auVar121._16_4_ ^ 0xffffffff;
                        auVar133._20_4_ = auVar121._20_4_ ^ 0xffffffff;
                        auVar133._24_4_ = auVar121._24_4_ ^ 0xffffffff;
                        auVar133._28_4_ = auVar121._28_4_ ^ 0xffffffff;
                        auVar160 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar133,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar133,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar160;
                        break;
                      }
                    }
                    auVar286 = ZEXT464((uint)fVar284);
                    *(float *)(ray + k * 4 + 0x100) = fVar284;
                    break;
                  }
                }
                lVar107 = lVar107 + -1;
              } while (lVar107 != 0);
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar131._4_4_ = uVar109;
              auVar131._0_4_ = uVar109;
              auVar131._8_4_ = uVar109;
              auVar131._12_4_ = uVar109;
              auVar131._16_4_ = uVar109;
              auVar131._20_4_ = uVar109;
              auVar131._24_4_ = uVar109;
              auVar131._28_4_ = uVar109;
              auVar121 = vcmpps_avx(_local_8e0,auVar131,2);
              auVar160 = vandps_avx(auVar121,local_6e0);
              auVar189 = ZEXT3264(auVar160);
              auVar121 = local_6e0 & auVar121;
              local_6e0 = auVar160;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
            auVar189 = ZEXT3264(local_380);
            auVar255 = ZEXT3264(local_7a0);
            auVar160 = local_b20;
          }
          auVar164._0_4_ = fVar217 * (float)local_800._0_4_;
          auVar164._4_4_ = fVar234 * (float)local_800._4_4_;
          auVar164._8_4_ = fVar233 * fStack_7f8;
          auVar164._12_4_ = fVar232 * fStack_7f4;
          auVar164._16_4_ = fVar266 * fStack_7f0;
          auVar164._20_4_ = fVar236 * fStack_7ec;
          auVar164._28_36_ = auVar189._28_36_;
          auVar164._24_4_ = fVar235 * fStack_7e8;
          auVar6 = vfmadd213ps_fma(local_960,_local_8a0,auVar164._0_32_);
          auVar6 = vfmadd213ps_fma(local_940,_local_8c0,ZEXT1632(auVar6));
          auVar121 = vandps_avx(ZEXT1632(auVar6),local_920);
          auVar185._8_4_ = 0x3e99999a;
          auVar185._0_8_ = 0x3e99999a3e99999a;
          auVar185._12_4_ = 0x3e99999a;
          auVar185._16_4_ = 0x3e99999a;
          auVar185._20_4_ = 0x3e99999a;
          auVar185._24_4_ = 0x3e99999a;
          auVar185._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar185,1);
          auVar121 = vorps_avx(auVar121,local_760);
          auVar186._0_4_ = auVar160._0_4_ + (float)local_a60._0_4_;
          auVar186._4_4_ = auVar160._4_4_ + (float)local_a60._4_4_;
          auVar186._8_4_ = auVar160._8_4_ + fStack_a58;
          auVar186._12_4_ = auVar160._12_4_ + fStack_a54;
          auVar186._16_4_ = auVar160._16_4_ + fStack_a50;
          auVar186._20_4_ = auVar160._20_4_ + fStack_a4c;
          auVar186._24_4_ = auVar160._24_4_ + fStack_a48;
          auVar186._28_4_ = auVar160._28_4_ + fStack_a44;
          auVar160 = vcmpps_avx(auVar186,auVar131,2);
          local_940 = vandps_avx(auVar160,auVar255._0_32_);
          auVar187._8_4_ = 3;
          auVar187._0_8_ = 0x300000003;
          auVar187._12_4_ = 3;
          auVar187._16_4_ = 3;
          auVar187._20_4_ = 3;
          auVar187._24_4_ = 3;
          auVar187._28_4_ = 3;
          auVar215._8_4_ = 2;
          auVar215._0_8_ = 0x200000002;
          auVar215._12_4_ = 2;
          auVar215._16_4_ = 2;
          auVar215._20_4_ = 2;
          auVar215._24_4_ = 2;
          auVar215._28_4_ = 2;
          auVar160 = vblendvps_avx(auVar215,auVar187,auVar121);
          local_960 = vpcmpgtd_avx2(auVar160,local_780);
          auVar160 = vpandn_avx2(local_960,local_940);
          auVar121 = local_940 & ~local_960;
          local_700 = auVar160;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar7 = vminps_avx(auVar2,auVar4);
            auVar6 = vmaxps_avx(auVar2,auVar4);
            auVar117 = vminps_avx(auVar3,auVar5);
            auVar111 = vminps_avx(auVar7,auVar117);
            auVar7 = vmaxps_avx(auVar3,auVar5);
            auVar117 = vmaxps_avx(auVar6,auVar7);
            local_ae0._8_4_ = 0x7fffffff;
            local_ae0._0_8_ = 0x7fffffff7fffffff;
            local_ae0._12_4_ = 0x7fffffff;
            auVar6 = vandps_avx(auVar111,local_ae0._0_16_);
            auVar7 = vandps_avx(auVar117,local_ae0._0_16_);
            auVar6 = vmaxps_avx(auVar6,auVar7);
            auVar7 = vmovshdup_avx(auVar6);
            auVar7 = vmaxss_avx(auVar7,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar7);
            local_9c0._0_4_ = auVar6._0_4_ * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar117,auVar117,0xff);
            local_8e0._4_4_ = (float)local_a60._4_4_ + local_380._4_4_;
            local_8e0._0_4_ = (float)local_a60._0_4_ + local_380._0_4_;
            fStack_8d8 = fStack_a58 + local_380._8_4_;
            fStack_8d4 = fStack_a54 + local_380._12_4_;
            fStack_8d0 = fStack_a50 + local_380._16_4_;
            fStack_8cc = fStack_a4c + local_380._20_4_;
            fStack_8c8 = fStack_a48 + local_380._24_4_;
            fStack_8c4 = fStack_a44 + local_380._28_4_;
            local_9e0 = local_380;
            do {
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar134,local_9e0,auVar160);
              auVar18 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar18 = vminps_avx(auVar121,auVar18);
              auVar19 = vshufpd_avx(auVar18,auVar18,5);
              auVar18 = vminps_avx(auVar18,auVar19);
              auVar19 = vpermpd_avx2(auVar18,0x4e);
              auVar18 = vminps_avx(auVar18,auVar19);
              auVar18 = vcmpps_avx(auVar121,auVar18,0);
              auVar19 = auVar160 & auVar18;
              auVar121 = auVar160;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar18,auVar160);
              }
              uVar101 = vmovmskps_avx(auVar121);
              iVar24 = 0;
              for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar102 = iVar24 << 2;
              local_700 = auVar160;
              *(undefined4 *)(local_700 + uVar102) = 0;
              uVar101 = *(uint *)(local_1c0 + uVar102);
              uVar102 = *(uint *)(local_360 + uVar102);
              fVar217 = auVar17._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar217 = sqrtf((float)local_a20._0_4_);
              }
              local_a40._0_4_ = fVar217 * 1.9073486e-06;
              auVar6 = vinsertps_avx(ZEXT416(uVar102),ZEXT416(uVar101),0x10);
              auVar271 = ZEXT1664(auVar6);
              lVar107 = 5;
              do {
                auVar167 = auVar271._0_16_;
                local_b80._0_16_ = vmovshdup_avx(auVar167);
                fVar231 = local_b80._0_4_;
                fVar232 = 1.0 - fVar231;
                fVar237 = fVar232 * fVar232 * fVar232;
                fVar233 = fVar231 * fVar231;
                fVar234 = fVar231 * fVar233;
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                         ZEXT416((uint)fVar234));
                fVar217 = fVar231 * fVar232;
                auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar217 * 6.0)),
                                           ZEXT416((uint)(fVar232 * fVar217)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * fVar217 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar231 * fVar217)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar234),
                                         ZEXT416((uint)fVar237));
                fVar231 = (auVar6._0_4_ + auVar111._0_4_) * 0.16666667;
                fVar234 = fVar234 * 0.16666667;
                auVar152._0_4_ = fVar234 * fVar141;
                auVar152._4_4_ = fVar234 * fStack_c0c;
                auVar152._8_4_ = fVar234 * fStack_c08;
                auVar152._12_4_ = fVar234 * fStack_c04;
                auVar202._4_4_ = fVar231;
                auVar202._0_4_ = fVar231;
                auVar202._8_4_ = fVar231;
                auVar202._12_4_ = fVar231;
                auVar6 = vfmadd132ps_fma(auVar202,auVar152,auVar3);
                fVar231 = (auVar7._0_4_ + auVar117._0_4_) * 0.16666667;
                auVar153._4_4_ = fVar231;
                auVar153._0_4_ = fVar231;
                auVar153._8_4_ = fVar231;
                auVar153._12_4_ = fVar231;
                auVar6 = vfmadd132ps_fma(auVar153,auVar6,auVar4);
                fVar234 = auVar271._0_4_;
                auVar174._4_4_ = fVar234;
                auVar174._0_4_ = fVar234;
                auVar174._8_4_ = fVar234;
                auVar174._12_4_ = fVar234;
                auVar7 = vfmadd213ps_fma(auVar174,local_a10,_DAT_01f7aa10);
                fVar237 = fVar237 * 0.16666667;
                auVar116._4_4_ = fVar237;
                auVar116._0_4_ = fVar237;
                auVar116._8_4_ = fVar237;
                auVar116._12_4_ = fVar237;
                auVar6 = vfmadd132ps_fma(auVar116,auVar6,auVar2);
                local_820._0_16_ = auVar6;
                auVar7 = vsubps_avx(auVar7,auVar6);
                auVar6 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar231 = auVar6._0_4_;
                if (fVar231 < 0.0) {
                  local_ba0._0_16_ = ZEXT416((uint)fVar232);
                  local_b00._0_4_ = fVar233;
                  local_aa0._0_4_ = fVar217;
                  auVar291._0_4_ = sqrtf(fVar231);
                  auVar291._4_60_ = extraout_var_00;
                  auVar117 = auVar291._0_16_;
                  fVar233 = (float)local_b00._0_4_;
                  fVar217 = (float)local_aa0._0_4_;
                  auVar111 = local_ba0._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar6,auVar6);
                  auVar111 = ZEXT416((uint)fVar232);
                }
                fVar237 = auVar111._0_4_;
                auVar118._4_4_ = fVar237;
                auVar118._0_4_ = fVar237;
                auVar118._8_4_ = fVar237;
                auVar118._12_4_ = fVar237;
                auVar148 = vfnmsub213ss_fma(local_b80._0_16_,local_b80._0_16_,
                                            ZEXT416((uint)(fVar217 * 4.0)));
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * 4.0)),auVar111,auVar111);
                fVar217 = fVar237 * -fVar237 * 0.5;
                fVar237 = auVar148._0_4_ * 0.5;
                fVar232 = auVar112._0_4_ * 0.5;
                fVar233 = fVar233 * 0.5;
                auVar243._0_4_ = fVar141 * fVar233;
                auVar243._4_4_ = fStack_c0c * fVar233;
                auVar243._8_4_ = fStack_c08 * fVar233;
                auVar243._12_4_ = fStack_c04 * fVar233;
                auVar203._4_4_ = fVar232;
                auVar203._0_4_ = fVar232;
                auVar203._8_4_ = fVar232;
                auVar203._12_4_ = fVar232;
                auVar112 = vfmadd213ps_fma(auVar203,auVar3,auVar243);
                auVar223._4_4_ = fVar237;
                auVar223._0_4_ = fVar237;
                auVar223._8_4_ = fVar237;
                auVar223._12_4_ = fVar237;
                auVar112 = vfmadd213ps_fma(auVar223,auVar4,auVar112);
                auVar281._4_4_ = fVar217;
                auVar281._0_4_ = fVar217;
                auVar281._8_4_ = fVar217;
                auVar281._12_4_ = fVar217;
                auVar168 = vfmadd213ps_fma(auVar281,auVar2,auVar112);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar111,local_b80._0_16_)
                ;
                auVar148 = vfmadd213ss_fma(local_b80._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar111)
                ;
                auVar111 = vshufps_avx(auVar167,auVar167,0x55);
                auVar204._0_4_ = fVar141 * auVar111._0_4_;
                auVar204._4_4_ = fStack_c0c * auVar111._4_4_;
                auVar204._8_4_ = fStack_c08 * auVar111._8_4_;
                auVar204._12_4_ = fStack_c04 * auVar111._12_4_;
                uVar109 = auVar148._0_4_;
                auVar224._4_4_ = uVar109;
                auVar224._0_4_ = uVar109;
                auVar224._8_4_ = uVar109;
                auVar224._12_4_ = uVar109;
                auVar111 = vfmadd213ps_fma(auVar224,auVar3,auVar204);
                auVar175._0_4_ = auVar112._0_4_;
                auVar175._4_4_ = auVar175._0_4_;
                auVar175._8_4_ = auVar175._0_4_;
                auVar175._12_4_ = auVar175._0_4_;
                auVar111 = vfmadd213ps_fma(auVar175,auVar4,auVar111);
                auVar177 = vfmadd231ps_fma(auVar111,auVar2,auVar118);
                auVar112 = vdpps_avx(auVar168,auVar168,0x7f);
                auVar111 = vblendps_avx(auVar112,_DAT_01f7aa10,0xe);
                auVar148 = vrsqrtss_avx(auVar111,auVar111);
                fVar217 = auVar148._0_4_;
                fVar233 = auVar112._0_4_;
                fVar217 = fVar217 * 1.5 + fVar233 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar148 = vdpps_avx(auVar168,auVar177,0x7f);
                auVar176._0_4_ = auVar177._0_4_ * fVar233;
                auVar176._4_4_ = auVar177._4_4_ * fVar233;
                auVar176._8_4_ = auVar177._8_4_ * fVar233;
                auVar176._12_4_ = auVar177._12_4_ * fVar233;
                fVar237 = auVar148._0_4_;
                auVar244._0_4_ = auVar168._0_4_ * fVar237;
                auVar244._4_4_ = auVar168._4_4_ * fVar237;
                fVar232 = auVar168._8_4_;
                auVar244._8_4_ = fVar232 * fVar237;
                fVar266 = auVar168._12_4_;
                auVar244._12_4_ = fVar266 * fVar237;
                auVar148 = vsubps_avx(auVar176,auVar244);
                auVar111 = vrcpss_avx(auVar111,auVar111);
                auVar177 = vfnmadd213ss_fma(auVar111,auVar112,ZEXT416(0x40000000));
                fVar237 = auVar111._0_4_ * auVar177._0_4_;
                auVar111 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(fVar234 * (float)local_a40._0_4_)));
                auVar189 = ZEXT1664(auVar111);
                auVar252._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = -fVar232;
                auVar252._12_4_ = -fVar266;
                auVar205._0_4_ = fVar217 * auVar148._0_4_ * fVar237;
                auVar205._4_4_ = fVar217 * auVar148._4_4_ * fVar237;
                auVar205._8_4_ = fVar217 * auVar148._8_4_ * fVar237;
                auVar205._12_4_ = fVar217 * auVar148._12_4_ * fVar237;
                auVar268._0_4_ = auVar168._0_4_ * fVar217;
                auVar268._4_4_ = auVar168._4_4_ * fVar217;
                auVar268._8_4_ = fVar232 * fVar217;
                auVar268._12_4_ = fVar266 * fVar217;
                local_b80._0_16_ = auVar168;
                local_ba0._0_4_ = auVar111._0_4_;
                if (fVar233 < -fVar233) {
                  local_b00._0_4_ = auVar117._0_4_;
                  local_aa0._0_16_ = auVar252;
                  local_b20._0_16_ = auVar268;
                  local_ac0._0_16_ = auVar205;
                  fVar217 = sqrtf(fVar233);
                  auVar189 = ZEXT464((uint)local_ba0._0_4_);
                  auVar117 = ZEXT416((uint)local_b00._0_4_);
                  auVar205 = local_ac0._0_16_;
                  auVar252 = local_aa0._0_16_;
                  auVar268 = local_b20._0_16_;
                }
                else {
                  auVar111 = vsqrtss_avx(auVar112,auVar112);
                  fVar217 = auVar111._0_4_;
                }
                auVar111 = vdpps_avx(auVar7,auVar268,0x7f);
                auVar177 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar117,auVar189._0_16_);
                auVar112 = vdpps_avx(auVar252,auVar268,0x7f);
                auVar148 = vdpps_avx(auVar7,auVar205,0x7f);
                auVar168 = vdpps_avx(local_a10,auVar268,0x7f);
                auVar177 = vfmadd213ss_fma(ZEXT416((uint)(auVar117._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9c0._0_4_ / fVar217)),
                                           auVar177);
                auVar286 = ZEXT1664(auVar177);
                fVar217 = auVar112._0_4_ + auVar148._0_4_;
                auVar291 = ZEXT464((uint)fVar217);
                auVar119._0_4_ = auVar111._0_4_ * auVar111._0_4_;
                auVar119._4_4_ = auVar111._4_4_ * auVar111._4_4_;
                auVar119._8_4_ = auVar111._8_4_ * auVar111._8_4_;
                auVar119._12_4_ = auVar111._12_4_ * auVar111._12_4_;
                auVar117 = vdpps_avx(auVar7,auVar252,0x7f);
                auVar148 = vsubps_avx(auVar6,auVar119);
                auVar112 = vrsqrtss_avx(auVar148,auVar148);
                fVar237 = auVar148._0_4_;
                fVar234 = auVar112._0_4_;
                fVar234 = fVar234 * 1.5 + fVar237 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar112 = vdpps_avx(auVar7,local_a10,0x7f);
                auVar117 = vfnmadd231ss_fma(auVar117,auVar111,ZEXT416((uint)fVar217));
                auVar112 = vfnmadd231ss_fma(auVar112,auVar111,auVar168);
                if (fVar237 < 0.0) {
                  local_b00._0_16_ = auVar111;
                  local_aa0._0_4_ = auVar177._0_4_;
                  local_b20._0_16_ = ZEXT416((uint)fVar217);
                  local_ac0._0_16_ = auVar168;
                  local_b40._0_16_ = auVar117;
                  local_840._0_4_ = fVar234;
                  local_860._0_16_ = auVar112;
                  fVar217 = sqrtf(fVar237);
                  auVar291 = ZEXT1664(local_b20._0_16_);
                  auVar286 = ZEXT464((uint)local_aa0._0_4_);
                  auVar189 = ZEXT464((uint)local_ba0._0_4_);
                  fVar234 = (float)local_840._0_4_;
                  auVar112 = local_860._0_16_;
                  auVar111 = local_b00._0_16_;
                  auVar168 = local_ac0._0_16_;
                  auVar117 = local_b40._0_16_;
                }
                else {
                  auVar148 = vsqrtss_avx(auVar148,auVar148);
                  fVar217 = auVar148._0_4_;
                }
                auVar282 = ZEXT1664(auVar111);
                auVar255 = ZEXT1664(local_b80._0_16_);
                auVar148 = vpermilps_avx(local_820._0_16_,0xff);
                fVar217 = fVar217 - auVar148._0_4_;
                auVar148 = vshufps_avx(local_b80._0_16_,local_b80._0_16_,0xff);
                auVar117 = vfmsub213ss_fma(auVar117,ZEXT416((uint)fVar234),auVar148);
                auVar206._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar168._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar168._12_4_ ^ 0x80000000;
                auVar225._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                auVar225._8_4_ = auVar117._8_4_ ^ 0x80000000;
                auVar225._12_4_ = auVar117._12_4_ ^ 0x80000000;
                auVar177 = ZEXT416((uint)(auVar112._0_4_ * fVar234));
                auVar218 = auVar291._0_16_;
                auVar112 = vfmsub231ss_fma(ZEXT416((uint)(auVar168._0_4_ * auVar117._0_4_)),auVar218
                                           ,auVar177);
                auVar117 = vinsertps_avx(auVar225,auVar177,0x1c);
                uVar109 = auVar112._0_4_;
                auVar226._4_4_ = uVar109;
                auVar226._0_4_ = uVar109;
                auVar226._8_4_ = uVar109;
                auVar226._12_4_ = uVar109;
                auVar117 = vdivps_avx(auVar117,auVar226);
                auVar112 = vinsertps_avx(auVar218,auVar206,0x10);
                auVar112 = vdivps_avx(auVar112,auVar226);
                fVar234 = auVar111._0_4_;
                auVar178._0_4_ = fVar234 * auVar117._0_4_ + fVar217 * auVar112._0_4_;
                auVar178._4_4_ = fVar234 * auVar117._4_4_ + fVar217 * auVar112._4_4_;
                auVar178._8_4_ = fVar234 * auVar117._8_4_ + fVar217 * auVar112._8_4_;
                auVar178._12_4_ = fVar234 * auVar117._12_4_ + fVar217 * auVar112._12_4_;
                auVar167 = vsubps_avx(auVar167,auVar178);
                auVar271 = ZEXT1664(auVar167);
                auVar117 = vandps_avx(auVar111,local_ae0._0_16_);
                if (auVar117._0_4_ < auVar286._0_4_) {
                  auVar112 = vfmadd231ss_fma(ZEXT416((uint)(auVar189._0_4_ + auVar286._0_4_)),
                                             local_880._0_16_,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar217),local_ae0._0_16_);
                  if (auVar117._0_4_ < auVar112._0_4_) {
                    fVar217 = auVar167._0_4_ + (float)local_980._0_4_;
                    if ((fVar217 < fVar108) ||
                       (fVar234 = *(float *)(ray + k * 4 + 0x100), fVar234 < fVar217)) break;
                    auVar117 = vmovshdup_avx(auVar167);
                    fVar237 = auVar117._0_4_;
                    if ((fVar237 < 0.0) || (1.0 < fVar237)) break;
                    auVar6 = vrsqrtss_avx(auVar6,auVar6);
                    fVar233 = auVar6._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar98].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar231 = fVar233 * 1.5 + fVar231 * -0.5 * fVar233 * fVar233 * fVar233;
                    local_c40 = auVar7._0_4_;
                    fStack_c3c = auVar7._4_4_;
                    fStack_c38 = auVar7._8_4_;
                    fStack_c34 = auVar7._12_4_;
                    auVar207._0_4_ = fVar231 * local_c40;
                    auVar207._4_4_ = fVar231 * fStack_c3c;
                    auVar207._8_4_ = fVar231 * fStack_c38;
                    auVar207._12_4_ = fVar231 * fStack_c34;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,local_b80._0_16_);
                    auVar6 = vshufps_avx(auVar207,auVar207,0xc9);
                    auVar7 = vshufps_avx(local_b80._0_16_,local_b80._0_16_,0xc9);
                    auVar208._0_4_ = auVar207._0_4_ * auVar7._0_4_;
                    auVar208._4_4_ = auVar207._4_4_ * auVar7._4_4_;
                    auVar208._8_4_ = auVar207._8_4_ * auVar7._8_4_;
                    auVar208._12_4_ = auVar207._12_4_ * auVar7._12_4_;
                    auVar112 = vfmsub231ps_fma(auVar208,local_b80._0_16_,auVar6);
                    auVar6 = vshufps_avx(auVar112,auVar112,0xc9);
                    auVar7 = vshufps_avx(auVar148,auVar148,0xc9);
                    auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                    auVar154._0_4_ = auVar148._0_4_ * auVar112._0_4_;
                    auVar154._4_4_ = auVar148._4_4_ * auVar112._4_4_;
                    auVar154._8_4_ = auVar148._8_4_ * auVar112._8_4_;
                    auVar154._12_4_ = auVar148._12_4_ * auVar112._12_4_;
                    auVar6 = vfmsub231ps_fma(auVar154,auVar6,auVar7);
                    uVar109 = auVar6._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar217;
                      uVar9 = vextractps_avx(auVar6,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar6,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar109;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar237;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_b48;
                      *(uint *)(ray + k * 4 + 0x240) = uVar98;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar14 = context->user;
                    local_440 = auVar117._0_8_;
                    auVar7 = vmovshdup_avx(auVar6);
                    local_4a0._8_8_ = auVar7._0_8_;
                    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
                    local_480 = auVar6._0_8_;
                    local_4a0._0_8_ = local_4a0._8_8_;
                    local_4a0._16_8_ = local_4a0._8_8_;
                    local_4a0._24_8_ = local_4a0._8_8_;
                    uStack_478 = local_480;
                    uStack_470 = local_480;
                    uStack_468 = local_480;
                    local_460 = uVar109;
                    uStack_45c = uVar109;
                    uStack_458 = uVar109;
                    uStack_454 = uVar109;
                    uStack_450 = uVar109;
                    uStack_44c = uVar109;
                    uStack_448 = uVar109;
                    uStack_444 = uVar109;
                    uStack_438 = local_440;
                    uStack_430 = local_440;
                    uStack_428 = local_440;
                    auVar179._12_4_ = 0;
                    auVar179._0_12_ = ZEXT812(0);
                    auVar179 = auVar179 << 0x20;
                    local_420 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_400 = CONCAT44(uStack_67c,local_680);
                    uStack_3f8 = CONCAT44(uStack_674,uStack_678);
                    uStack_3f0 = CONCAT44(uStack_66c,uStack_670);
                    uStack_3e8 = CONCAT44(uStack_664,uStack_668);
                    local_3e0._4_4_ = uStack_65c;
                    local_3e0._0_4_ = local_660;
                    local_3e0._8_4_ = uStack_658;
                    local_3e0._12_4_ = uStack_654;
                    local_3e0._16_4_ = uStack_650;
                    local_3e0._20_4_ = uStack_64c;
                    local_3e0._24_4_ = uStack_648;
                    local_3e0._28_4_ = uStack_644;
                    auVar160 = vpcmpeqd_avx2(local_3e0,local_3e0);
                    local_b50[1] = auVar160;
                    *local_b50 = auVar160;
                    local_3c0 = pRVar14->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = pRVar14->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar217;
                    local_9a0 = local_6a0;
                    local_bd0.valid = (int *)local_9a0;
                    local_bd0.geometryUserPtr = pGVar10->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = (RTCHitN *)local_4a0;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar255 = ZEXT1664(local_b80._0_16_);
                      auVar271 = ZEXT1664(auVar167);
                      auVar282 = ZEXT1664(auVar111);
                      auVar286 = ZEXT1664(auVar286._0_16_);
                      auVar291 = ZEXT1664(auVar218);
                      (*pGVar10->intersectionFilterN)(&local_bd0);
                      auVar179 = ZEXT816(0) << 0x40;
                    }
                    auVar121 = ZEXT1632(auVar179);
                    auVar160 = vpcmpeqd_avx2(local_9a0,auVar121);
                    auVar160 = _DAT_01fe9960 & ~auVar160;
                    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar160 >> 0x7f,0) != '\0') ||
                          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar160 >> 0xbf,0) != '\0') ||
                        (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar160[0x1f] < '\0') {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        auVar291 = ZEXT1664(auVar291._0_16_);
                        (*p_Var15)(&local_bd0);
                        auVar121 = ZEXT832(0) << 0x40;
                      }
                      auVar121 = vpcmpeqd_avx2(local_9a0,auVar121);
                      auVar160 = _DAT_01fe9960 & ~auVar121;
                      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar160 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar160 >> 0x7f,0) != '\0') ||
                            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar160 >> 0xbf,0) != '\0') ||
                          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar160[0x1f] < '\0') {
                        auVar135._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
                        auVar135._8_4_ = auVar121._8_4_ ^ 0xffffffff;
                        auVar135._12_4_ = auVar121._12_4_ ^ 0xffffffff;
                        auVar135._16_4_ = auVar121._16_4_ ^ 0xffffffff;
                        auVar135._20_4_ = auVar121._20_4_ ^ 0xffffffff;
                        auVar135._24_4_ = auVar121._24_4_ ^ 0xffffffff;
                        auVar135._28_4_ = auVar121._28_4_ ^ 0xffffffff;
                        auVar160 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar160;
                        auVar160 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar160;
                        auVar160 = vpmaskmovd_avx2(auVar135,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar160;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar234;
                    break;
                  }
                }
                lVar107 = lVar107 + -1;
              } while (lVar107 != 0);
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar131._4_4_ = uVar109;
              auVar131._0_4_ = uVar109;
              auVar131._8_4_ = uVar109;
              auVar131._12_4_ = uVar109;
              auVar131._16_4_ = uVar109;
              auVar131._20_4_ = uVar109;
              auVar131._24_4_ = uVar109;
              auVar131._28_4_ = uVar109;
              auVar121 = vcmpps_avx(_local_8e0,auVar131,2);
              auVar160 = vandps_avx(auVar121,local_700);
              auVar121 = local_700 & auVar121;
              local_700 = auVar160;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar188._0_4_ = (float)local_a60._0_4_ + local_4e0._0_4_;
          auVar188._4_4_ = (float)local_a60._4_4_ + local_4e0._4_4_;
          auVar188._8_4_ = fStack_a58 + local_4e0._8_4_;
          auVar188._12_4_ = fStack_a54 + local_4e0._12_4_;
          auVar188._16_4_ = fStack_a50 + local_4e0._16_4_;
          auVar188._20_4_ = fStack_a4c + local_4e0._20_4_;
          auVar188._24_4_ = fStack_a48 + local_4e0._24_4_;
          auVar188._28_4_ = fStack_a44 + local_4e0._28_4_;
          auVar121 = vcmpps_avx(auVar188,auVar131,2);
          auVar160 = vandps_avx(local_740,local_720);
          auVar160 = vandps_avx(auVar121,auVar160);
          auVar216._0_4_ = (float)local_a60._0_4_ + local_380._0_4_;
          auVar216._4_4_ = (float)local_a60._4_4_ + local_380._4_4_;
          auVar216._8_4_ = fStack_a58 + local_380._8_4_;
          auVar216._12_4_ = fStack_a54 + local_380._12_4_;
          auVar216._16_4_ = fStack_a50 + local_380._16_4_;
          auVar216._20_4_ = fStack_a4c + local_380._20_4_;
          auVar216._24_4_ = fStack_a48 + local_380._24_4_;
          auVar216._28_4_ = fStack_a44 + local_380._28_4_;
          auVar18 = vcmpps_avx(auVar216,auVar131,2);
          auVar121 = vandps_avx(local_960,local_940);
          auVar121 = vandps_avx(auVar18,auVar121);
          auVar121 = vorps_avx(auVar160,auVar121);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar104 * 0x60) = auVar121;
            auVar160 = vblendvps_avx(local_380,local_4e0,auVar160);
            *(undefined1 (*) [32])(auStack_160 + uVar104 * 0x60) = auVar160;
            uVar166 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar104 * 0xc] = uVar166;
            aiStack_138[uVar104 * 0x18] = iVar99 + 1;
            iVar103 = iVar103 + 1;
          }
        }
      }
    }
    if (iVar103 == 0) break;
    uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar136._4_4_ = uVar109;
    auVar136._0_4_ = uVar109;
    auVar136._8_4_ = uVar109;
    auVar136._12_4_ = uVar109;
    auVar136._16_4_ = uVar109;
    auVar136._20_4_ = uVar109;
    auVar136._24_4_ = uVar109;
    auVar136._28_4_ = uVar109;
    uVar101 = -iVar103;
    pauVar100 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar103 - 1) * 0x60);
    fVar217 = (float)local_a60._0_4_;
    fVar231 = (float)local_a60._4_4_;
    fVar234 = fStack_a58;
    fVar237 = fStack_a54;
    fVar233 = fStack_a50;
    fVar232 = fStack_a4c;
    fVar266 = fStack_a48;
    fVar236 = fStack_a44;
    while( true ) {
      auVar160 = pauVar100[1];
      auVar161._0_4_ = fVar217 + auVar160._0_4_;
      auVar161._4_4_ = fVar231 + auVar160._4_4_;
      auVar161._8_4_ = fVar234 + auVar160._8_4_;
      auVar161._12_4_ = fVar237 + auVar160._12_4_;
      auVar161._16_4_ = fVar233 + auVar160._16_4_;
      auVar161._20_4_ = fVar232 + auVar160._20_4_;
      auVar161._24_4_ = fVar266 + auVar160._24_4_;
      auVar161._28_4_ = fVar236 + auVar160._28_4_;
      auVar18 = vcmpps_avx(auVar161,auVar136,2);
      auVar121 = vandps_avx(auVar18,*pauVar100);
      local_4a0 = auVar121;
      auVar18 = *pauVar100 & auVar18;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') break;
      pauVar100 = pauVar100 + -3;
      uVar101 = uVar101 + 1;
      fVar217 = (float)local_a60._0_4_;
      fVar231 = (float)local_a60._4_4_;
      fVar234 = fStack_a58;
      fVar237 = fStack_a54;
      fVar233 = fStack_a50;
      fVar232 = fStack_a4c;
      fVar266 = fStack_a48;
      fVar236 = fStack_a44;
      if (uVar101 == 0) goto LAB_018a1cc2;
    }
    auVar137._8_4_ = 0x7f800000;
    auVar137._0_8_ = 0x7f8000007f800000;
    auVar137._12_4_ = 0x7f800000;
    auVar137._16_4_ = 0x7f800000;
    auVar137._20_4_ = 0x7f800000;
    auVar137._24_4_ = 0x7f800000;
    auVar137._28_4_ = 0x7f800000;
    auVar160 = vblendvps_avx(auVar137,auVar160,auVar121);
    auVar18 = vshufps_avx(auVar160,auVar160,0xb1);
    auVar18 = vminps_avx(auVar160,auVar18);
    auVar19 = vshufpd_avx(auVar18,auVar18,5);
    auVar18 = vminps_avx(auVar18,auVar19);
    auVar19 = vpermpd_avx2(auVar18,0x4e);
    auVar18 = vminps_avx(auVar18,auVar19);
    auVar160 = vcmpps_avx(auVar160,auVar18,0);
    auVar18 = auVar121 & auVar160;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar121 = vandps_avx(auVar160,auVar121);
    }
    uVar105 = *(ulong *)pauVar100[2];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar105;
    uVar102 = vmovmskps_avx(auVar121);
    iVar103 = 0;
    for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
      iVar103 = iVar103 + 1;
    }
    *(undefined4 *)(local_4a0 + (uint)(iVar103 << 2)) = 0;
    uVar102 = ~uVar101;
    if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4a0 >> 0x7f,0) != '\0') ||
          (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4a0 >> 0xbf,0) != '\0') ||
        (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4a0[0x1f] < '\0') {
      uVar102 = -uVar101;
    }
    uVar104 = (ulong)uVar102;
    iVar99 = *(int *)(pauVar100[2] + 8);
    *pauVar100 = local_4a0;
    uVar109 = (undefined4)uVar105;
    auVar162._4_4_ = uVar109;
    auVar162._0_4_ = uVar109;
    auVar162._8_4_ = uVar109;
    auVar162._12_4_ = uVar109;
    auVar162._16_4_ = uVar109;
    auVar162._20_4_ = uVar109;
    auVar162._24_4_ = uVar109;
    auVar162._28_4_ = uVar109;
    auVar6 = vmovshdup_avx(auVar120);
    auVar6 = vsubps_avx(auVar6,auVar120);
    auVar138._0_4_ = auVar6._0_4_;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    auVar138._16_4_ = auVar138._0_4_;
    auVar138._20_4_ = auVar138._0_4_;
    auVar138._24_4_ = auVar138._0_4_;
    auVar138._28_4_ = auVar138._0_4_;
    auVar6 = vfmadd132ps_fma(auVar138,auVar162,_DAT_01faff20);
    local_4e0 = ZEXT1632(auVar6);
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_4e0 + (uint)(iVar103 << 2));
  } while( true );
LAB_018a1cc2:
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar140._4_4_ = uVar109;
  auVar140._0_4_ = uVar109;
  auVar140._8_4_ = uVar109;
  auVar140._12_4_ = uVar109;
  auVar140._16_4_ = uVar109;
  auVar140._20_4_ = uVar109;
  auVar140._24_4_ = uVar109;
  auVar140._28_4_ = uVar109;
  auVar160 = vcmpps_avx(local_2e0,auVar140,2);
  uVar98 = vmovmskps_avx(auVar160);
  uVar98 = uVar98 & (uint)local_968 - 1 & (uint)local_968;
  if (uVar98 == 0) {
    return;
  }
  goto LAB_0189f2aa;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }